

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<8>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  void *pvVar14;
  __int_type_conflict _Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar69;
  ulong uVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  float t1;
  undefined4 uVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar90;
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar94 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar107 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar133;
  float fVar134;
  undefined1 auVar122 [16];
  float fVar135;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vfloat4 b0;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar167;
  float fVar169;
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar168;
  float fVar170;
  float fVar172;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined8 uVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar188;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar189;
  float fVar190;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar211 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar241;
  undefined1 in_ZMM10 [64];
  vfloat4 a0_1;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  float fVar251;
  vfloat4 a0;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar252 [16];
  float fVar263;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar261;
  float fVar262;
  undefined1 in_ZMM12 [64];
  undefined1 auVar260 [64];
  float fVar264;
  float fVar274;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar291 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4c8 [16];
  int local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  undefined4 uStack_44c;
  undefined1 local_448 [32];
  undefined1 local_428 [16];
  ulong local_410;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  RTCFilterFunctionNArguments local_338;
  uint auStack_308 [4];
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2ec;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  uint uStack_1f8;
  float afStack_1f4 [7];
  undefined1 local_1d8 [32];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar68;
  undefined1 auVar130 [32];
  
  PVar11 = prim[1];
  uVar70 = (ulong)(byte)PVar11;
  fVar151 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar16 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar76._0_4_ = fVar151 * auVar16._0_4_;
  auVar76._4_4_ = fVar151 * auVar16._4_4_;
  auVar76._8_4_ = fVar151 * auVar16._8_4_;
  auVar76._12_4_ = fVar151 * auVar16._12_4_;
  auVar191._0_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar191._4_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar191._8_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar191._12_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar16);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar18 = vpmovsxbd_avx2(auVar276);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar19 = vpmovsxbd_avx2(auVar5);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar20 = vpmovsxbd_avx2(auVar6);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar70 + 6);
  auVar21 = vpmovsxbd_avx2(auVar7);
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar67 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar259 = vpmovsxbd_avx2(auVar8);
  auVar259 = vcvtdq2ps_avx(auVar259);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar67 + uVar70 + 6);
  auVar22 = vpmovsxbd_avx2(auVar9);
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar67 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar23 = vpmovsxbd_avx2(auVar10);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar278._4_4_ = auVar191._0_4_;
  auVar278._0_4_ = auVar191._0_4_;
  auVar278._8_4_ = auVar191._0_4_;
  auVar278._12_4_ = auVar191._0_4_;
  auVar278._16_4_ = auVar191._0_4_;
  auVar278._20_4_ = auVar191._0_4_;
  auVar278._24_4_ = auVar191._0_4_;
  auVar278._28_4_ = auVar191._0_4_;
  auVar16 = vmovshdup_avx(auVar191);
  uVar173 = auVar16._0_8_;
  auVar289._8_8_ = uVar173;
  auVar289._0_8_ = uVar173;
  auVar289._16_8_ = uVar173;
  auVar289._24_8_ = uVar173;
  auVar16 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar151 = auVar16._0_4_;
  auVar260._0_4_ = fVar151 * auVar18._0_4_;
  fVar168 = auVar16._4_4_;
  auVar260._4_4_ = fVar168 * auVar18._4_4_;
  auVar260._8_4_ = fVar151 * auVar18._8_4_;
  auVar260._12_4_ = fVar168 * auVar18._12_4_;
  auVar260._16_4_ = fVar151 * auVar18._16_4_;
  auVar260._20_4_ = fVar168 * auVar18._20_4_;
  auVar260._28_36_ = in_ZMM12._28_36_;
  auVar260._24_4_ = fVar151 * auVar18._24_4_;
  auVar282._0_4_ = auVar21._0_4_ * fVar151;
  auVar282._4_4_ = auVar21._4_4_ * fVar168;
  auVar282._8_4_ = auVar21._8_4_ * fVar151;
  auVar282._12_4_ = auVar21._12_4_ * fVar168;
  auVar282._16_4_ = auVar21._16_4_ * fVar151;
  auVar282._20_4_ = auVar21._20_4_ * fVar168;
  auVar282._28_36_ = in_ZMM10._28_36_;
  auVar282._24_4_ = auVar21._24_4_ * fVar151;
  auVar229._0_4_ = auVar23._0_4_ * fVar151;
  auVar229._4_4_ = auVar23._4_4_ * fVar168;
  auVar229._8_4_ = auVar23._8_4_ * fVar151;
  auVar229._12_4_ = auVar23._12_4_ * fVar168;
  auVar229._16_4_ = auVar23._16_4_ * fVar151;
  auVar229._20_4_ = auVar23._20_4_ * fVar168;
  auVar229._24_4_ = auVar23._24_4_ * fVar151;
  auVar229._28_4_ = 0;
  auVar16 = vfmadd231ps_fma(auVar260._0_32_,auVar289,auVar17);
  auVar4 = vfmadd231ps_fma(auVar282._0_32_,auVar289,auVar20);
  auVar276 = vfmadd231ps_fma(auVar229,auVar22,auVar289);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar278,auVar88);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar278,auVar19);
  auVar276 = vfmadd231ps_fma(ZEXT1632(auVar276),auVar259,auVar278);
  auVar279._4_4_ = auVar76._0_4_;
  auVar279._0_4_ = auVar76._0_4_;
  auVar279._8_4_ = auVar76._0_4_;
  auVar279._12_4_ = auVar76._0_4_;
  auVar279._16_4_ = auVar76._0_4_;
  auVar279._20_4_ = auVar76._0_4_;
  auVar279._24_4_ = auVar76._0_4_;
  auVar279._28_4_ = auVar76._0_4_;
  auVar16 = vmovshdup_avx(auVar76);
  uVar173 = auVar16._0_8_;
  auVar290._8_8_ = uVar173;
  auVar290._0_8_ = uVar173;
  auVar290._16_8_ = uVar173;
  auVar290._24_8_ = uVar173;
  auVar16 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar151 = auVar16._0_4_;
  auVar205._0_4_ = fVar151 * auVar18._0_4_;
  fVar168 = auVar16._4_4_;
  auVar205._4_4_ = fVar168 * auVar18._4_4_;
  auVar205._8_4_ = fVar151 * auVar18._8_4_;
  auVar205._12_4_ = fVar168 * auVar18._12_4_;
  auVar205._16_4_ = fVar151 * auVar18._16_4_;
  auVar205._20_4_ = fVar168 * auVar18._20_4_;
  auVar205._24_4_ = fVar151 * auVar18._24_4_;
  auVar205._28_4_ = 0;
  auVar25._4_4_ = auVar21._4_4_ * fVar168;
  auVar25._0_4_ = auVar21._0_4_ * fVar151;
  auVar25._8_4_ = auVar21._8_4_ * fVar151;
  auVar25._12_4_ = auVar21._12_4_ * fVar168;
  auVar25._16_4_ = auVar21._16_4_ * fVar151;
  auVar25._20_4_ = auVar21._20_4_ * fVar168;
  auVar25._24_4_ = auVar21._24_4_ * fVar151;
  auVar25._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = auVar23._4_4_ * fVar168;
  auVar18._0_4_ = auVar23._0_4_ * fVar151;
  auVar18._8_4_ = auVar23._8_4_ * fVar151;
  auVar18._12_4_ = auVar23._12_4_ * fVar168;
  auVar18._16_4_ = auVar23._16_4_ * fVar151;
  auVar18._20_4_ = auVar23._20_4_ * fVar168;
  auVar18._24_4_ = auVar23._24_4_ * fVar151;
  auVar18._28_4_ = fVar168;
  auVar16 = vfmadd231ps_fma(auVar205,auVar290,auVar17);
  auVar6 = vfmadd231ps_fma(auVar25,auVar290,auVar20);
  auVar7 = vfmadd231ps_fma(auVar18,auVar290,auVar22);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar279,auVar88);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar279,auVar19);
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar147._16_4_ = 0x219392ef;
  auVar147._20_4_ = 0x219392ef;
  auVar147._24_4_ = 0x219392ef;
  auVar147._28_4_ = 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar5),auVar116);
  auVar88 = vcmpps_avx(auVar88,auVar147,1);
  auVar17 = vblendvps_avx(ZEXT1632(auVar5),auVar147,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar4),auVar116);
  auVar88 = vcmpps_avx(auVar88,auVar147,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar4),auVar147,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar276),auVar116);
  auVar88 = vcmpps_avx(auVar88,auVar147,1);
  auVar88 = vblendvps_avx(ZEXT1632(auVar276),auVar147,auVar88);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar279,auVar259);
  auVar19 = vrcpps_avx(auVar17);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = &DAT_3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar165._16_4_ = 0x3f800000;
  auVar165._20_4_ = 0x3f800000;
  auVar165._24_4_ = 0x3f800000;
  auVar165._28_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar17,auVar19,auVar165);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar19,auVar19);
  auVar17 = vrcpps_avx(auVar18);
  auVar4 = vfnmadd213ps_fma(auVar18,auVar17,auVar165);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar88);
  auVar276 = vfnmadd213ps_fma(auVar88,auVar17,auVar165);
  auVar276 = vfmadd132ps_fma(ZEXT1632(auVar276),auVar17,auVar17);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar8));
  auVar19._4_4_ = auVar16._4_4_ * auVar88._4_4_;
  auVar19._0_4_ = auVar16._0_4_ * auVar88._0_4_;
  auVar19._8_4_ = auVar16._8_4_ * auVar88._8_4_;
  auVar19._12_4_ = auVar16._12_4_ * auVar88._12_4_;
  auVar19._16_4_ = auVar88._16_4_ * 0.0;
  auVar19._20_4_ = auVar88._20_4_ * 0.0;
  auVar19._24_4_ = auVar88._24_4_ * 0.0;
  auVar19._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar8));
  auVar20._4_4_ = auVar16._4_4_ * auVar88._4_4_;
  auVar20._0_4_ = auVar16._0_4_ * auVar88._0_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar88._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar88._12_4_;
  auVar20._16_4_ = auVar88._16_4_ * 0.0;
  auVar20._20_4_ = auVar88._20_4_ * 0.0;
  auVar20._24_4_ = auVar88._24_4_ * 0.0;
  auVar20._28_4_ = auVar88._28_4_;
  auVar102._1_3_ = 0;
  auVar102[0] = PVar11;
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar11 * 0x10 + uVar70 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar6));
  auVar21._4_4_ = auVar88._4_4_ * auVar4._4_4_;
  auVar21._0_4_ = auVar88._0_4_ * auVar4._0_4_;
  auVar21._8_4_ = auVar88._8_4_ * auVar4._8_4_;
  auVar21._12_4_ = auVar88._12_4_ * auVar4._12_4_;
  auVar21._16_4_ = auVar88._16_4_ * 0.0;
  auVar21._20_4_ = auVar88._20_4_ * 0.0;
  auVar21._24_4_ = auVar88._24_4_ * 0.0;
  auVar21._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar17);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar6));
  auVar259._4_4_ = auVar4._4_4_ * auVar88._4_4_;
  auVar259._0_4_ = auVar4._0_4_ * auVar88._0_4_;
  auVar259._8_4_ = auVar4._8_4_ * auVar88._8_4_;
  auVar259._12_4_ = auVar4._12_4_ * auVar88._12_4_;
  auVar259._16_4_ = auVar88._16_4_ * 0.0;
  auVar259._20_4_ = auVar88._20_4_ * 0.0;
  auVar259._24_4_ = auVar88._24_4_ * 0.0;
  auVar259._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 + uVar70 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar5));
  auVar22._4_4_ = auVar88._4_4_ * auVar276._4_4_;
  auVar22._0_4_ = auVar88._0_4_ * auVar276._0_4_;
  auVar22._8_4_ = auVar88._8_4_ * auVar276._8_4_;
  auVar22._12_4_ = auVar88._12_4_ * auVar276._12_4_;
  auVar22._16_4_ = auVar88._16_4_ * 0.0;
  auVar22._20_4_ = auVar88._20_4_ * 0.0;
  auVar22._24_4_ = auVar88._24_4_ * 0.0;
  auVar22._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar5));
  auVar23._4_4_ = auVar276._4_4_ * auVar88._4_4_;
  auVar23._0_4_ = auVar276._0_4_ * auVar88._0_4_;
  auVar23._8_4_ = auVar276._8_4_ * auVar88._8_4_;
  auVar23._12_4_ = auVar276._12_4_ * auVar88._12_4_;
  auVar23._16_4_ = auVar88._16_4_ * 0.0;
  auVar23._20_4_ = auVar88._20_4_ * 0.0;
  auVar23._24_4_ = auVar88._24_4_ * 0.0;
  auVar23._28_4_ = auVar88._28_4_;
  auVar88 = vpminsd_avx2(auVar19,auVar20);
  auVar17 = vpminsd_avx2(auVar21,auVar259);
  auVar88 = vmaxps_avx(auVar88,auVar17);
  uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar206._4_4_ = uVar74;
  auVar206._0_4_ = uVar74;
  auVar206._8_4_ = uVar74;
  auVar206._12_4_ = uVar74;
  auVar206._16_4_ = uVar74;
  auVar206._20_4_ = uVar74;
  auVar206._24_4_ = uVar74;
  auVar206._28_4_ = uVar74;
  auVar17 = vpminsd_avx2(auVar22,auVar23);
  auVar17 = vmaxps_avx(auVar17,auVar206);
  auVar88 = vmaxps_avx(auVar88,auVar17);
  local_1d8._4_4_ = auVar88._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar88._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar88._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar88._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar88._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar88._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar88._24_4_ * 0.99999964;
  local_1d8._28_4_ = auVar17._28_4_;
  auVar88 = vpmaxsd_avx2(auVar19,auVar20);
  auVar17 = vpmaxsd_avx2(auVar21,auVar259);
  auVar88 = vminps_avx(auVar88,auVar17);
  auVar17 = vpmaxsd_avx2(auVar22,auVar23);
  fVar151 = (ray->super_RayK<1>).tfar;
  auVar117._4_4_ = fVar151;
  auVar117._0_4_ = fVar151;
  auVar117._8_4_ = fVar151;
  auVar117._12_4_ = fVar151;
  auVar117._16_4_ = fVar151;
  auVar117._20_4_ = fVar151;
  auVar117._24_4_ = fVar151;
  auVar117._28_4_ = fVar151;
  auVar17 = vminps_avx(auVar17,auVar117);
  auVar88 = vminps_avx(auVar88,auVar17);
  auVar26._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar26._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar26._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar26._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar26._16_4_ = auVar88._16_4_ * 1.0000004;
  auVar26._20_4_ = auVar88._20_4_ * 1.0000004;
  auVar26._24_4_ = auVar88._24_4_ * 1.0000004;
  auVar26._28_4_ = auVar88._28_4_;
  auVar102[4] = PVar11;
  auVar102._5_3_ = 0;
  auVar102[8] = PVar11;
  auVar102._9_3_ = 0;
  auVar102[0xc] = PVar11;
  auVar102._13_3_ = 0;
  auVar102[0x10] = PVar11;
  auVar102._17_3_ = 0;
  auVar102[0x14] = PVar11;
  auVar102._21_3_ = 0;
  auVar102[0x18] = PVar11;
  auVar102._25_3_ = 0;
  auVar102[0x1c] = PVar11;
  auVar102._29_3_ = 0;
  auVar17 = vpcmpgtd_avx2(auVar102,_DAT_0205a920);
  auVar88 = vcmpps_avx(local_1d8,auVar26,2);
  auVar88 = vandps_avx(auVar88,auVar17);
  uVar64 = vmovmskps_avx(auVar88);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_218 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_348 = 0x7fffffff;
  uStack_344 = 0x7fffffff;
  uStack_340 = 0x7fffffff;
  uStack_33c = 0x7fffffff;
LAB_018afe3f:
  lVar69 = 0;
  uVar70 = (ulong)uVar64;
  for (uVar67 = uVar70; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  uVar64 = *(uint *)(prim + 2);
  pGVar12 = (context->scene->geometries).items[uVar64].ptr;
  local_410 = (ulong)*(uint *)(prim + lVar69 * 4 + 6);
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar69 * 4 + 6));
  p_Var13 = pGVar12[1].intersectionFilterN;
  pvVar14 = pGVar12[2].userPtr;
  _Var15 = pGVar12[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar16 = *(undefined1 (*) [16])(_Var15 + uVar67 * (long)pvVar14);
  auVar4 = *(undefined1 (*) [16])(_Var15 + (uVar67 + 1) * (long)pvVar14);
  auVar276 = *(undefined1 (*) [16])(_Var15 + (uVar67 + 2) * (long)pvVar14);
  pfVar1 = (float *)(_Var15 + (long)pvVar14 * (uVar67 + 3));
  fVar151 = *pfVar1;
  fVar168 = pfVar1[1];
  fVar170 = pfVar1[2];
  fVar172 = pfVar1[3];
  lVar69 = *(long *)&pGVar12[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar69 + (long)p_Var13 * uVar67);
  auVar6 = *(undefined1 (*) [16])(lVar69 + (long)p_Var13 * (uVar67 + 1));
  auVar7 = *(undefined1 (*) [16])(lVar69 + (long)p_Var13 * (uVar67 + 2));
  uVar70 = uVar70 - 1 & uVar70;
  pfVar1 = (float *)(lVar69 + (long)p_Var13 * (uVar67 + 3));
  fVar90 = *pfVar1;
  fVar75 = pfVar1[1];
  fVar152 = pfVar1[2];
  fVar188 = pfVar1[3];
  if (uVar70 != 0) {
    uVar73 = uVar70 - 1 & uVar70;
    for (uVar67 = uVar70; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar73 != 0) {
      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  auVar105._0_4_ = fVar90 * -0.0;
  auVar105._4_4_ = fVar75 * -0.0;
  auVar105._8_4_ = fVar152 * -0.0;
  auVar105._12_4_ = fVar188 * -0.0;
  auVar8 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar7,auVar105);
  auVar77._0_4_ = auVar6._0_4_ + auVar8._0_4_;
  auVar77._4_4_ = auVar6._4_4_ + auVar8._4_4_;
  auVar77._8_4_ = auVar6._8_4_ + auVar8._8_4_;
  auVar77._12_4_ = auVar6._12_4_ + auVar8._12_4_;
  auVar9 = vfmadd231ps_fma(auVar77,auVar5,auVar91);
  auVar275 = ZEXT816(0) << 0x40;
  auVar92._0_4_ = fVar90 * 0.0;
  auVar92._4_4_ = fVar75 * 0.0;
  auVar92._8_4_ = fVar152 * 0.0;
  auVar92._12_4_ = fVar188 * 0.0;
  auVar284._8_4_ = 0x3f000000;
  auVar284._0_8_ = 0x3f0000003f000000;
  auVar284._12_4_ = 0x3f000000;
  auVar8 = vfmadd231ps_fma(auVar92,auVar7,auVar284);
  auVar8 = vfmadd231ps_fma(auVar8,auVar6,auVar275);
  auVar191 = vfnmadd231ps_fma(auVar8,auVar5,auVar284);
  auVar265._0_4_ = fVar151 * -0.0;
  auVar265._4_4_ = fVar168 * -0.0;
  auVar265._8_4_ = fVar170 * -0.0;
  auVar265._12_4_ = fVar172 * -0.0;
  auVar8 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar276,auVar265);
  auVar252._0_4_ = auVar8._0_4_ + auVar4._0_4_;
  auVar252._4_4_ = auVar8._4_4_ + auVar4._4_4_;
  auVar252._8_4_ = auVar8._8_4_ + auVar4._8_4_;
  auVar252._12_4_ = auVar8._12_4_ + auVar4._12_4_;
  auVar8 = vfmadd231ps_fma(auVar252,auVar16,auVar91);
  auVar242._0_4_ = fVar151 * 0.0;
  auVar242._4_4_ = fVar168 * 0.0;
  auVar242._8_4_ = fVar170 * 0.0;
  auVar242._12_4_ = fVar172 * 0.0;
  auVar10 = vfmadd231ps_fma(auVar242,auVar276,auVar284);
  auVar10 = vfmadd231ps_fma(auVar10,auVar4,auVar275);
  auVar214 = vfnmadd231ps_fma(auVar10,auVar16,auVar284);
  auVar106._0_4_ = auVar7._0_4_ + auVar105._0_4_;
  auVar106._4_4_ = auVar7._4_4_ + auVar105._4_4_;
  auVar106._8_4_ = auVar7._8_4_ + auVar105._8_4_;
  auVar106._12_4_ = auVar7._12_4_ + auVar105._12_4_;
  auVar10 = vfmadd231ps_fma(auVar106,auVar6,auVar275);
  auVar10 = vfmadd231ps_fma(auVar10,auVar5,auVar91);
  auVar122._0_4_ = fVar90 * 0.5;
  auVar122._4_4_ = fVar75 * 0.5;
  auVar122._8_4_ = fVar152 * 0.5;
  auVar122._12_4_ = fVar188 * 0.5;
  auVar7 = vfmadd231ps_fma(auVar122,auVar275,auVar7);
  auVar6 = vfnmadd231ps_fma(auVar7,auVar284,auVar6);
  auVar76 = vfmadd231ps_fma(auVar6,auVar275,auVar5);
  auVar208._0_4_ = auVar265._0_4_ + auVar276._0_4_;
  auVar208._4_4_ = auVar265._4_4_ + auVar276._4_4_;
  auVar208._8_4_ = auVar265._8_4_ + auVar276._8_4_;
  auVar208._12_4_ = auVar265._12_4_ + auVar276._12_4_;
  auVar5 = vfmadd231ps_fma(auVar208,auVar4,auVar275);
  auVar6 = vfmadd231ps_fma(auVar5,auVar16,auVar91);
  auVar223._0_4_ = fVar151 * 0.5;
  auVar223._4_4_ = fVar168 * 0.5;
  auVar223._8_4_ = fVar170 * 0.5;
  auVar223._12_4_ = fVar172 * 0.5;
  auVar276 = vfmadd231ps_fma(auVar223,auVar275,auVar276);
  auVar4 = vfnmadd231ps_fma(auVar276,auVar284,auVar4);
  auVar7 = vfmadd231ps_fma(auVar4,auVar275,auVar16);
  auVar16 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar4 = vshufps_avx(auVar8,auVar8,0xc9);
  fVar90 = auVar191._0_4_;
  auVar153._0_4_ = fVar90 * auVar4._0_4_;
  fVar75 = auVar191._4_4_;
  auVar153._4_4_ = fVar75 * auVar4._4_4_;
  fVar152 = auVar191._8_4_;
  auVar153._8_4_ = fVar152 * auVar4._8_4_;
  fVar188 = auVar191._12_4_;
  auVar153._12_4_ = fVar188 * auVar4._12_4_;
  auVar4 = vfmsub231ps_fma(auVar153,auVar16,auVar8);
  auVar276 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar4 = vshufps_avx(auVar214,auVar214,0xc9);
  auVar154._0_4_ = fVar90 * auVar4._0_4_;
  auVar154._4_4_ = fVar75 * auVar4._4_4_;
  auVar154._8_4_ = fVar152 * auVar4._8_4_;
  auVar154._12_4_ = fVar188 * auVar4._12_4_;
  auVar16 = vfmsub231ps_fma(auVar154,auVar16,auVar214);
  auVar5 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar4 = vshufps_avx(auVar6,auVar6,0xc9);
  fVar121 = auVar76._0_4_;
  auVar136._0_4_ = fVar121 * auVar4._0_4_;
  fVar133 = auVar76._4_4_;
  auVar136._4_4_ = fVar133 * auVar4._4_4_;
  fVar134 = auVar76._8_4_;
  auVar136._8_4_ = fVar134 * auVar4._8_4_;
  fVar135 = auVar76._12_4_;
  auVar136._12_4_ = fVar135 * auVar4._12_4_;
  auVar4 = vfmsub231ps_fma(auVar136,auVar16,auVar6);
  auVar6 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar4 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar174._0_4_ = fVar121 * auVar4._0_4_;
  auVar174._4_4_ = fVar133 * auVar4._4_4_;
  auVar174._8_4_ = fVar134 * auVar4._8_4_;
  auVar174._12_4_ = fVar135 * auVar4._12_4_;
  auVar4 = vfmsub231ps_fma(auVar174,auVar16,auVar7);
  auVar16 = vdpps_avx(auVar276,auVar276,0x7f);
  auVar7 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar168 = auVar16._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar168;
  auVar4 = vrsqrtss_avx(auVar224,auVar224);
  fVar151 = auVar4._0_4_;
  auVar4 = vdpps_avx(auVar276,auVar5,0x7f);
  fVar151 = fVar151 * 1.5 + fVar168 * -0.5 * fVar151 * fVar151 * fVar151;
  fVar150 = fVar151 * auVar276._0_4_;
  fVar167 = fVar151 * auVar276._4_4_;
  fVar169 = fVar151 * auVar276._8_4_;
  fVar171 = fVar151 * auVar276._12_4_;
  auVar232._0_4_ = auVar5._0_4_ * fVar168;
  auVar232._4_4_ = auVar5._4_4_ * fVar168;
  auVar232._8_4_ = auVar5._8_4_ * fVar168;
  auVar232._12_4_ = auVar5._12_4_ * fVar168;
  fVar168 = auVar4._0_4_;
  auVar192._0_4_ = fVar168 * auVar276._0_4_;
  auVar192._4_4_ = fVar168 * auVar276._4_4_;
  auVar192._8_4_ = fVar168 * auVar276._8_4_;
  auVar192._12_4_ = fVar168 * auVar276._12_4_;
  auVar276 = vsubps_avx(auVar232,auVar192);
  auVar4 = vrcpss_avx(auVar224,auVar224);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar4,SUB6416(ZEXT464(0x40000000),0));
  fVar170 = auVar4._0_4_ * auVar16._0_4_;
  auVar16 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar172 = auVar16._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar172;
  auVar4 = vrsqrtss_avx(auVar209,auVar209);
  fVar168 = auVar4._0_4_;
  fVar168 = fVar168 * 1.5 + fVar172 * -0.5 * fVar168 * fVar168 * fVar168;
  fVar251 = fVar168 * auVar6._0_4_;
  fVar261 = fVar168 * auVar6._4_4_;
  fVar262 = fVar168 * auVar6._8_4_;
  fVar263 = fVar168 * auVar6._12_4_;
  auVar4 = vdpps_avx(auVar6,auVar7,0x7f);
  auVar175._0_4_ = fVar172 * auVar7._0_4_;
  auVar175._4_4_ = fVar172 * auVar7._4_4_;
  auVar175._8_4_ = fVar172 * auVar7._8_4_;
  auVar175._12_4_ = fVar172 * auVar7._12_4_;
  fVar172 = auVar4._0_4_;
  auVar137._0_4_ = fVar172 * auVar6._0_4_;
  auVar137._4_4_ = fVar172 * auVar6._4_4_;
  auVar137._8_4_ = fVar172 * auVar6._8_4_;
  auVar137._12_4_ = fVar172 * auVar6._12_4_;
  auVar5 = vsubps_avx(auVar175,auVar137);
  auVar4 = vrcpss_avx(auVar209,auVar209);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar4,SUB6416(ZEXT464(0x40000000),0));
  fVar172 = auVar16._0_4_ * auVar4._0_4_;
  auVar16 = vshufps_avx(auVar9,auVar9,0xff);
  auVar210._0_4_ = auVar16._0_4_ * fVar150;
  auVar210._4_4_ = auVar16._4_4_ * fVar167;
  auVar210._8_4_ = auVar16._8_4_ * fVar169;
  auVar210._12_4_ = auVar16._12_4_ * fVar171;
  local_358 = vsubps_avx(auVar9,auVar210);
  auVar4 = vshufps_avx(auVar191,auVar191,0xff);
  auVar155._0_4_ = auVar4._0_4_ * fVar150 + auVar16._0_4_ * fVar151 * fVar170 * auVar276._0_4_;
  auVar155._4_4_ = auVar4._4_4_ * fVar167 + auVar16._4_4_ * fVar151 * fVar170 * auVar276._4_4_;
  auVar155._8_4_ = auVar4._8_4_ * fVar169 + auVar16._8_4_ * fVar151 * fVar170 * auVar276._8_4_;
  auVar155._12_4_ = auVar4._12_4_ * fVar171 + auVar16._12_4_ * fVar151 * fVar170 * auVar276._12_4_;
  auVar276 = vsubps_avx(auVar191,auVar155);
  local_368._0_4_ = auVar210._0_4_ + auVar9._0_4_;
  local_368._4_4_ = auVar210._4_4_ + auVar9._4_4_;
  fStack_360 = auVar210._8_4_ + auVar9._8_4_;
  fStack_35c = auVar210._12_4_ + auVar9._12_4_;
  auVar16 = vshufps_avx(auVar10,auVar10,0xff);
  auVar93._0_4_ = fVar251 * auVar16._0_4_;
  auVar93._4_4_ = fVar261 * auVar16._4_4_;
  auVar93._8_4_ = fVar262 * auVar16._8_4_;
  auVar93._12_4_ = fVar263 * auVar16._12_4_;
  local_378 = vsubps_avx(auVar10,auVar93);
  auVar4 = vshufps_avx(auVar76,auVar76,0xff);
  auVar78._0_4_ = fVar251 * auVar4._0_4_ + auVar16._0_4_ * fVar168 * auVar5._0_4_ * fVar172;
  auVar78._4_4_ = fVar261 * auVar4._4_4_ + auVar16._4_4_ * fVar168 * auVar5._4_4_ * fVar172;
  auVar78._8_4_ = fVar262 * auVar4._8_4_ + auVar16._8_4_ * fVar168 * auVar5._8_4_ * fVar172;
  auVar78._12_4_ = fVar263 * auVar4._12_4_ + auVar16._12_4_ * fVar168 * auVar5._12_4_ * fVar172;
  auVar16 = vsubps_avx(auVar76,auVar78);
  local_3e8 = auVar10._0_4_ + auVar93._0_4_;
  fStack_3e4 = auVar10._4_4_ + auVar93._4_4_;
  fStack_3e0 = auVar10._8_4_ + auVar93._8_4_;
  fStack_3dc = auVar10._12_4_ + auVar93._12_4_;
  local_388._0_4_ = local_358._0_4_ + auVar276._0_4_ * 0.33333334;
  local_388._4_4_ = local_358._4_4_ + auVar276._4_4_ * 0.33333334;
  local_388._8_4_ = local_358._8_4_ + auVar276._8_4_ * 0.33333334;
  local_388._12_4_ = local_358._12_4_ + auVar276._12_4_ * 0.33333334;
  auVar79._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar79._12_4_ = auVar16._12_4_ * 0.33333334;
  local_398 = vsubps_avx(local_378,auVar79);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar276 = vsubps_avx(local_358,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar276,auVar276,0x55);
  auVar4 = vshufps_avx(auVar276,auVar276,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar151 = (pre->ray_space).vz.field_0.m128[0];
  fVar168 = (pre->ray_space).vz.field_0.m128[1];
  fVar170 = (pre->ray_space).vz.field_0.m128[2];
  fVar172 = (pre->ray_space).vz.field_0.m128[3];
  auVar80._0_4_ = fVar151 * auVar4._0_4_;
  auVar80._4_4_ = fVar168 * auVar4._4_4_;
  auVar80._8_4_ = fVar170 * auVar4._8_4_;
  auVar80._12_4_ = fVar172 * auVar4._12_4_;
  auVar10 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar3,auVar16);
  auVar4 = vsubps_avx(local_388,(undefined1  [16])aVar2);
  local_468 = auVar4._0_4_;
  auVar16 = vshufps_avx(auVar4,auVar4,0x55);
  auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
  auVar81._0_4_ = fVar151 * auVar4._0_4_;
  auVar81._4_4_ = fVar168 * auVar4._4_4_;
  auVar81._8_4_ = fVar170 * auVar4._8_4_;
  auVar81._12_4_ = fVar172 * auVar4._12_4_;
  auVar76 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar3,auVar16);
  auVar4 = vsubps_avx(local_398,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar4,auVar4,0xaa);
  auVar82._0_4_ = fVar151 * auVar16._0_4_;
  auVar82._4_4_ = fVar168 * auVar16._4_4_;
  auVar82._8_4_ = fVar170 * auVar16._8_4_;
  auVar82._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar4,auVar4,0x55);
  auVar191 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar3,auVar16);
  auVar5 = vsubps_avx(local_378,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar83._0_4_ = fVar151 * auVar16._0_4_;
  auVar83._4_4_ = fVar168 * auVar16._4_4_;
  auVar83._8_4_ = fVar170 * auVar16._8_4_;
  auVar83._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar5,auVar5,0x55);
  auVar214 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar3,auVar16);
  auVar6 = vsubps_avx(_local_368,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar6,auVar6,0xaa);
  auVar156._0_4_ = fVar151 * auVar16._0_4_;
  auVar156._4_4_ = fVar168 * auVar16._4_4_;
  auVar156._8_4_ = fVar170 * auVar16._8_4_;
  auVar156._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar6,auVar6,0x55);
  auVar275 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar3,auVar16);
  local_3a8._0_4_ = (fVar90 + auVar155._0_4_) * 0.33333334 + (float)local_368._0_4_;
  local_3a8._4_4_ = (fVar75 + auVar155._4_4_) * 0.33333334 + (float)local_368._4_4_;
  fStack_3a0 = (fVar152 + auVar155._8_4_) * 0.33333334 + fStack_360;
  fStack_39c = (fVar188 + auVar155._12_4_) * 0.33333334 + fStack_35c;
  auVar7 = vsubps_avx(_local_3a8,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar7,auVar7,0xaa);
  auVar243._0_4_ = fVar151 * auVar16._0_4_;
  auVar243._4_4_ = fVar168 * auVar16._4_4_;
  auVar243._8_4_ = fVar170 * auVar16._8_4_;
  auVar243._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar7,auVar7,0x55);
  auVar77 = vfmadd231ps_fma(auVar243,(undefined1  [16])aVar3,auVar16);
  auVar233._0_4_ = (fVar121 + auVar78._0_4_) * 0.33333334;
  auVar233._4_4_ = (fVar133 + auVar78._4_4_) * 0.33333334;
  auVar233._8_4_ = (fVar134 + auVar78._8_4_) * 0.33333334;
  auVar233._12_4_ = (fVar135 + auVar78._12_4_) * 0.33333334;
  auVar140._4_4_ = fStack_3e4;
  auVar140._0_4_ = local_3e8;
  auVar140._8_4_ = fStack_3e0;
  auVar140._12_4_ = fStack_3dc;
  _local_3b8 = vsubps_avx(auVar140,auVar233);
  auVar8 = vsubps_avx(_local_3b8,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar234._0_4_ = fVar151 * auVar16._0_4_;
  auVar234._4_4_ = fVar168 * auVar16._4_4_;
  auVar234._8_4_ = fVar170 * auVar16._8_4_;
  auVar234._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar8,auVar8,0x55);
  auVar78 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar3,auVar16);
  auVar9 = vsubps_avx(auVar140,(undefined1  [16])aVar2);
  auVar16 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar193._0_4_ = fVar151 * auVar16._0_4_;
  auVar193._4_4_ = fVar168 * auVar16._4_4_;
  auVar193._8_4_ = fVar170 * auVar16._8_4_;
  auVar193._12_4_ = fVar172 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar9,auVar9,0x55);
  auVar16 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar3,auVar16);
  local_428._0_4_ = auVar276._0_4_;
  auVar176._4_4_ = local_428._0_4_;
  auVar176._0_4_ = local_428._0_4_;
  auVar176._8_4_ = local_428._0_4_;
  auVar176._12_4_ = local_428._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar10 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar176);
  auVar177._4_4_ = local_468;
  auVar177._0_4_ = local_468;
  auVar177._8_4_ = local_468;
  auVar177._12_4_ = local_468;
  auVar76 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar177);
  uVar74 = auVar4._0_4_;
  auVar178._4_4_ = uVar74;
  auVar178._0_4_ = uVar74;
  auVar178._8_4_ = uVar74;
  auVar178._12_4_ = uVar74;
  auVar191 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar178);
  uVar74 = auVar5._0_4_;
  auVar179._4_4_ = uVar74;
  auVar179._0_4_ = uVar74;
  auVar179._8_4_ = uVar74;
  auVar179._12_4_ = uVar74;
  auVar5 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar3,auVar179);
  uVar74 = auVar6._0_4_;
  auVar180._4_4_ = uVar74;
  auVar180._0_4_ = uVar74;
  auVar180._8_4_ = uVar74;
  auVar180._12_4_ = uVar74;
  auVar6 = vfmadd231ps_fma(auVar275,(undefined1  [16])aVar3,auVar180);
  uVar74 = auVar7._0_4_;
  auVar181._4_4_ = uVar74;
  auVar181._0_4_ = uVar74;
  auVar181._8_4_ = uVar74;
  auVar181._12_4_ = uVar74;
  auVar7 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar181);
  uVar74 = auVar8._0_4_;
  auVar84._4_4_ = uVar74;
  auVar84._0_4_ = uVar74;
  auVar84._8_4_ = uVar74;
  auVar84._12_4_ = uVar74;
  auVar8 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar3,auVar84);
  uVar74 = auVar9._0_4_;
  auVar85._4_4_ = uVar74;
  auVar85._0_4_ = uVar74;
  auVar85._8_4_ = uVar74;
  auVar85._12_4_ = uVar74;
  auVar9 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar85);
  local_478 = vmovlhps_avx(auVar10,auVar6);
  local_488 = vmovlhps_avx(auVar76,auVar7);
  local_498 = vmovlhps_avx(auVar191,auVar8);
  _local_278 = vmovlhps_avx(auVar5,auVar9);
  auVar282 = ZEXT1664(_local_278);
  auVar16 = vminps_avx(local_478,local_488);
  auVar4 = vminps_avx(local_498,_local_278);
  auVar276 = vminps_avx(auVar16,auVar4);
  auVar16 = vmaxps_avx(local_478,local_488);
  auVar4 = vmaxps_avx(local_498,_local_278);
  auVar16 = vmaxps_avx(auVar16,auVar4);
  auVar4 = vshufpd_avx(auVar276,auVar276,3);
  auVar276 = vminps_avx(auVar276,auVar4);
  auVar4 = vshufpd_avx(auVar16,auVar16,3);
  auVar4 = vmaxps_avx(auVar16,auVar4);
  auVar275._4_4_ = uStack_344;
  auVar275._0_4_ = local_348;
  auVar275._8_4_ = uStack_340;
  auVar275._12_4_ = uStack_33c;
  auVar16 = vandps_avx(auVar275,auVar276);
  auVar4 = vandps_avx(auVar275,auVar4);
  auVar16 = vmaxps_avx(auVar16,auVar4);
  auVar4 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar4,auVar16);
  local_198 = auVar16._0_4_ * 9.536743e-07;
  auVar285._8_8_ = auVar10._0_8_;
  auVar285._0_8_ = auVar10._0_8_;
  auVar211._8_8_ = auVar76._0_8_;
  auVar211._0_8_ = auVar76._0_8_;
  auVar94._8_8_ = auVar191._0_8_;
  auVar94._0_8_ = auVar191._0_8_;
  auVar107._8_8_ = auVar5._0_8_;
  auVar107._0_8_ = auVar5._0_8_;
  local_428 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  uVar67 = 0;
  local_248 = vsubps_avx(local_488,local_478);
  local_258 = vsubps_avx(local_498,local_488);
  local_268 = vsubps_avx(_local_278,local_498);
  local_298 = vsubps_avx(_local_368,local_358);
  local_2a8 = vsubps_avx(_local_3a8,local_388);
  local_2b8 = vsubps_avx(_local_3b8,local_398);
  auVar214._4_4_ = fStack_3e4;
  auVar214._0_4_ = local_3e8;
  auVar214._8_4_ = fStack_3e0;
  auVar214._12_4_ = fStack_3dc;
  _local_2c8 = vsubps_avx(auVar214,local_378);
  local_4c8 = ZEXT816(0x3f80000000000000);
  local_288 = local_4c8;
  do {
    auVar16 = vshufps_avx(local_4c8,local_4c8,0x50);
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = &DAT_3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._0_16_ = auVar123;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar4 = vsubps_avx(auVar123,auVar16);
    fVar151 = auVar16._0_4_;
    fVar134 = auVar6._0_4_;
    auVar86._0_4_ = fVar134 * fVar151;
    fVar168 = auVar16._4_4_;
    fVar135 = auVar6._4_4_;
    auVar86._4_4_ = fVar135 * fVar168;
    fVar170 = auVar16._8_4_;
    auVar86._8_4_ = fVar134 * fVar170;
    fVar172 = auVar16._12_4_;
    auVar86._12_4_ = fVar135 * fVar172;
    fVar264 = auVar7._0_4_;
    auVar157._0_4_ = fVar264 * fVar151;
    fVar274 = auVar7._4_4_;
    auVar157._4_4_ = fVar274 * fVar168;
    auVar157._8_4_ = fVar264 * fVar170;
    auVar157._12_4_ = fVar274 * fVar172;
    fVar231 = auVar8._0_4_;
    auVar194._0_4_ = fVar231 * fVar151;
    fVar241 = auVar8._4_4_;
    auVar194._4_4_ = fVar241 * fVar168;
    auVar194._8_4_ = fVar231 * fVar170;
    auVar194._12_4_ = fVar241 * fVar172;
    fVar121 = auVar9._0_4_;
    auVar235._0_4_ = fVar121 * fVar151;
    fVar133 = auVar9._4_4_;
    auVar235._4_4_ = fVar133 * fVar168;
    auVar235._8_4_ = fVar121 * fVar170;
    auVar235._12_4_ = fVar133 * fVar172;
    auVar10 = vfmadd231ps_fma(auVar86,auVar4,auVar285);
    auVar76 = vfmadd231ps_fma(auVar157,auVar4,auVar211);
    auVar191 = vfmadd231ps_fma(auVar194,auVar4,auVar94);
    auVar214 = vfmadd231ps_fma(auVar235,auVar107,auVar4);
    local_468 = auVar214._0_4_;
    auVar16 = vmovshdup_avx(local_288);
    fVar151 = local_288._0_4_;
    fVar90 = (auVar16._0_4_ - fVar151) * 0.04761905;
    auVar222._4_4_ = fVar151;
    auVar222._0_4_ = fVar151;
    auVar222._8_4_ = fVar151;
    auVar222._12_4_ = fVar151;
    auVar222._16_4_ = fVar151;
    auVar222._20_4_ = fVar151;
    auVar222._24_4_ = fVar151;
    auVar222._28_4_ = fVar151;
    auVar118._0_8_ = auVar16._0_8_;
    auVar118._8_8_ = auVar118._0_8_;
    auVar118._16_8_ = auVar118._0_8_;
    auVar118._24_8_ = auVar118._0_8_;
    auVar88 = vsubps_avx(auVar118,auVar222);
    uVar74 = auVar10._0_4_;
    auVar291._4_4_ = uVar74;
    auVar291._0_4_ = uVar74;
    auVar291._8_4_ = uVar74;
    auVar291._12_4_ = uVar74;
    auVar291._16_4_ = uVar74;
    auVar291._20_4_ = uVar74;
    auVar291._24_4_ = uVar74;
    auVar291._28_4_ = uVar74;
    auVar16 = vmovshdup_avx(auVar10);
    uVar173 = auVar16._0_8_;
    auVar272._8_8_ = uVar173;
    auVar272._0_8_ = uVar173;
    auVar272._16_8_ = uVar173;
    auVar272._24_8_ = uVar173;
    fVar75 = auVar76._0_4_;
    auVar103._4_4_ = fVar75;
    auVar103._0_4_ = fVar75;
    auVar103._8_4_ = fVar75;
    auVar103._12_4_ = fVar75;
    auVar103._16_4_ = fVar75;
    auVar103._20_4_ = fVar75;
    auVar103._24_4_ = fVar75;
    auVar103._28_4_ = fVar75;
    auVar4 = vmovshdup_avx(auVar76);
    auVar185._0_8_ = auVar4._0_8_;
    auVar185._8_8_ = auVar185._0_8_;
    auVar185._16_8_ = auVar185._0_8_;
    auVar185._24_8_ = auVar185._0_8_;
    fVar150 = auVar191._0_4_;
    auVar250._4_4_ = fVar150;
    auVar250._0_4_ = fVar150;
    auVar250._8_4_ = fVar150;
    auVar250._12_4_ = fVar150;
    auVar250._16_4_ = fVar150;
    auVar250._20_4_ = fVar150;
    auVar250._24_4_ = fVar150;
    auVar250._28_4_ = fVar150;
    auVar276 = vmovshdup_avx(auVar191);
    auVar230._0_8_ = auVar276._0_8_;
    auVar230._8_8_ = auVar230._0_8_;
    auVar230._16_8_ = auVar230._0_8_;
    auVar230._24_8_ = auVar230._0_8_;
    auVar5 = vmovshdup_avx(auVar214);
    auVar275 = vfmadd132ps_fma(auVar88,auVar222,_DAT_02020f20);
    auVar88 = vsubps_avx(auVar130,ZEXT1632(auVar275));
    fVar151 = auVar275._0_4_;
    auVar283._0_4_ = fVar75 * fVar151;
    fVar168 = auVar275._4_4_;
    auVar283._4_4_ = fVar75 * fVar168;
    fVar170 = auVar275._8_4_;
    auVar283._8_4_ = fVar75 * fVar170;
    fVar172 = auVar275._12_4_;
    auVar283._12_4_ = fVar75 * fVar172;
    auVar283._16_4_ = fVar75 * 0.0;
    auVar283._20_4_ = fVar75 * 0.0;
    auVar283._28_36_ = auVar282._28_36_;
    auVar283._24_4_ = fVar75 * 0.0;
    auVar275 = vfmadd231ps_fma(auVar283._0_32_,auVar88,auVar291);
    fVar152 = auVar4._0_4_;
    fVar188 = auVar4._4_4_;
    auVar17._4_4_ = fVar188 * fVar168;
    auVar17._0_4_ = fVar152 * fVar151;
    auVar17._8_4_ = fVar152 * fVar170;
    auVar17._12_4_ = fVar188 * fVar172;
    auVar17._16_4_ = fVar152 * 0.0;
    auVar17._20_4_ = fVar188 * 0.0;
    auVar17._24_4_ = fVar152 * 0.0;
    auVar17._28_4_ = local_468;
    auVar77 = vfmadd231ps_fma(auVar17,auVar88,auVar272);
    auVar27._4_4_ = fVar150 * fVar168;
    auVar27._0_4_ = fVar150 * fVar151;
    auVar27._8_4_ = fVar150 * fVar170;
    auVar27._12_4_ = fVar150 * fVar172;
    auVar27._16_4_ = fVar150 * 0.0;
    auVar27._20_4_ = fVar150 * 0.0;
    auVar27._24_4_ = fVar150 * 0.0;
    auVar27._28_4_ = auVar16._4_4_;
    auVar78 = vfmadd231ps_fma(auVar27,auVar88,auVar103);
    fVar152 = auVar276._0_4_;
    fVar188 = auVar276._4_4_;
    auVar28._4_4_ = fVar188 * fVar168;
    auVar28._0_4_ = fVar152 * fVar151;
    auVar28._8_4_ = fVar152 * fVar170;
    auVar28._12_4_ = fVar188 * fVar172;
    auVar28._16_4_ = fVar152 * 0.0;
    auVar28._20_4_ = fVar188 * 0.0;
    auVar28._24_4_ = fVar152 * 0.0;
    auVar28._28_4_ = uVar74;
    auVar140 = vfmadd231ps_fma(auVar28,auVar88,auVar185);
    auVar16 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar186._0_8_ = auVar16._0_8_;
    auVar186._8_8_ = auVar186._0_8_;
    auVar186._16_8_ = auVar186._0_8_;
    auVar186._24_8_ = auVar186._0_8_;
    auVar4 = vshufps_avx(auVar10,auVar10,0xff);
    uStack_400 = auVar4._0_8_;
    local_408 = (undefined1  [8])uStack_400;
    uStack_3f8 = uStack_400;
    uStack_3f0 = uStack_400;
    auVar29._4_4_ = fVar168 * local_468;
    auVar29._0_4_ = fVar151 * local_468;
    auVar29._8_4_ = fVar170 * local_468;
    auVar29._12_4_ = fVar172 * local_468;
    auVar29._16_4_ = local_468 * 0.0;
    auVar29._20_4_ = local_468 * 0.0;
    auVar29._24_4_ = local_468 * 0.0;
    auVar29._28_4_ = 0x3f800000;
    auVar79 = vfmadd231ps_fma(auVar29,auVar88,auVar250);
    auVar276 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar148._0_8_ = auVar276._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    auVar10 = vshufps_avx(auVar76,auVar76,0xff);
    auVar166._0_8_ = auVar10._0_8_;
    auVar166._8_8_ = auVar166._0_8_;
    auVar166._16_8_ = auVar166._0_8_;
    auVar166._24_8_ = auVar166._0_8_;
    fVar152 = auVar5._0_4_;
    fVar188 = auVar5._4_4_;
    auVar30._4_4_ = fVar188 * fVar168;
    auVar30._0_4_ = fVar152 * fVar151;
    auVar30._8_4_ = fVar152 * fVar170;
    auVar30._12_4_ = fVar188 * fVar172;
    auVar30._16_4_ = fVar152 * 0.0;
    auVar30._20_4_ = fVar188 * 0.0;
    auVar30._24_4_ = fVar152 * 0.0;
    auVar30._28_4_ = fVar150;
    auVar80 = vfmadd231ps_fma(auVar30,auVar88,auVar230);
    auVar31._28_4_ = fVar75;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar172,
                            CONCAT48(auVar78._8_4_ * fVar170,
                                     CONCAT44(auVar78._4_4_ * fVar168,auVar78._0_4_ * fVar151))));
    auVar275 = vfmadd231ps_fma(auVar31,auVar88,ZEXT1632(auVar275));
    auVar32._28_4_ = auVar4._4_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar140._12_4_ * fVar172,
                            CONCAT48(auVar140._8_4_ * fVar170,
                                     CONCAT44(auVar140._4_4_ * fVar168,auVar140._0_4_ * fVar151))));
    auVar77 = vfmadd231ps_fma(auVar32,auVar88,ZEXT1632(auVar77));
    auVar4 = vshufps_avx(auVar191,auVar191,0xaa);
    uVar173 = auVar4._0_8_;
    auVar258._8_8_ = uVar173;
    auVar258._0_8_ = uVar173;
    auVar258._16_8_ = uVar173;
    auVar258._24_8_ = uVar173;
    auVar5 = vshufps_avx(auVar191,auVar191,0xff);
    uVar173 = auVar5._0_8_;
    auVar280._8_8_ = uVar173;
    auVar280._0_8_ = uVar173;
    auVar280._16_8_ = uVar173;
    auVar280._24_8_ = uVar173;
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar79._12_4_,
                                                 CONCAT48(fVar170 * auVar79._8_4_,
                                                          CONCAT44(fVar168 * auVar79._4_4_,
                                                                   fVar151 * auVar79._0_4_)))),
                              auVar88,ZEXT1632(auVar78));
    auVar76 = vshufps_avx(auVar214,auVar214,0xaa);
    auVar191 = vshufps_avx(auVar214,auVar214,0xff);
    local_468 = auVar191._0_4_;
    fStack_464 = auVar191._4_4_;
    auVar33._28_4_ = fStack_464;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(auVar80._12_4_ * fVar172,
                            CONCAT48(auVar80._8_4_ * fVar170,
                                     CONCAT44(auVar80._4_4_ * fVar168,auVar80._0_4_ * fVar151))));
    auVar191 = vfmadd231ps_fma(auVar33,auVar88,ZEXT1632(auVar140));
    auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar78._12_4_,
                                                  CONCAT48(fVar170 * auVar78._8_4_,
                                                           CONCAT44(fVar168 * auVar78._4_4_,
                                                                    fVar151 * auVar78._0_4_)))),
                               auVar88,ZEXT1632(auVar275));
    auVar17 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar275));
    auVar275 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar191._12_4_,
                                                  CONCAT48(fVar170 * auVar191._8_4_,
                                                           CONCAT44(fVar168 * auVar191._4_4_,
                                                                    fVar151 * auVar191._0_4_)))),
                               auVar88,ZEXT1632(auVar77));
    auVar18 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar77));
    fVar150 = fVar90 * auVar17._0_4_ * 3.0;
    fVar167 = fVar90 * auVar17._4_4_ * 3.0;
    auVar34._4_4_ = fVar167;
    auVar34._0_4_ = fVar150;
    fStack_460 = fVar90 * auVar17._8_4_ * 3.0;
    auVar34._8_4_ = fStack_460;
    fStack_45c = fVar90 * auVar17._12_4_ * 3.0;
    auVar34._12_4_ = fStack_45c;
    fStack_458 = fVar90 * auVar17._16_4_ * 3.0;
    auVar34._16_4_ = fStack_458;
    fStack_454 = fVar90 * auVar17._20_4_ * 3.0;
    auVar34._20_4_ = fStack_454;
    fStack_450 = fVar90 * auVar17._24_4_ * 3.0;
    auVar34._24_4_ = fStack_450;
    auVar34._28_4_ = 0x40400000;
    local_3d8._0_4_ = fVar90 * auVar18._0_4_ * 3.0;
    local_3d8._4_4_ = fVar90 * auVar18._4_4_ * 3.0;
    fStack_3d0 = fVar90 * auVar18._8_4_ * 3.0;
    fStack_3cc = fVar90 * auVar18._12_4_ * 3.0;
    fStack_3c8 = fVar90 * auVar18._16_4_ * 3.0;
    fStack_3c4 = fVar90 * auVar18._20_4_ * 3.0;
    fStack_3c0 = fVar90 * auVar18._24_4_ * 3.0;
    fStack_3bc = auVar18._28_4_;
    fVar75 = auVar276._0_4_;
    fVar152 = auVar276._4_4_;
    auVar35._4_4_ = fVar152 * fVar168;
    auVar35._0_4_ = fVar75 * fVar151;
    auVar35._8_4_ = fVar75 * fVar170;
    auVar35._12_4_ = fVar152 * fVar172;
    auVar35._16_4_ = fVar75 * 0.0;
    auVar35._20_4_ = fVar152 * 0.0;
    auVar35._24_4_ = fVar75 * 0.0;
    auVar35._28_4_ = auVar17._28_4_;
    auVar276 = vfmadd231ps_fma(auVar35,auVar88,auVar186);
    fVar75 = auVar10._0_4_;
    fVar188 = auVar10._4_4_;
    auVar36._4_4_ = fVar188 * fVar168;
    auVar36._0_4_ = fVar75 * fVar151;
    auVar36._8_4_ = fVar75 * fVar170;
    auVar36._12_4_ = fVar188 * fVar172;
    auVar36._16_4_ = fVar75 * 0.0;
    auVar36._20_4_ = fVar188 * 0.0;
    auVar36._24_4_ = fVar75 * 0.0;
    auVar36._28_4_ = auVar16._4_4_;
    auVar16 = vfmadd231ps_fma(auVar36,auVar88,_local_408);
    fVar75 = auVar4._0_4_;
    fVar188 = auVar4._4_4_;
    auVar37._4_4_ = fVar188 * fVar168;
    auVar37._0_4_ = fVar75 * fVar151;
    auVar37._8_4_ = fVar75 * fVar170;
    auVar37._12_4_ = fVar188 * fVar172;
    auVar37._16_4_ = fVar75 * 0.0;
    auVar37._20_4_ = fVar188 * 0.0;
    auVar37._24_4_ = fVar75 * 0.0;
    auVar37._28_4_ = fVar90;
    auVar4 = vfmadd231ps_fma(auVar37,auVar88,auVar148);
    fVar75 = auVar5._0_4_;
    fVar169 = auVar5._4_4_;
    auVar38._4_4_ = fVar169 * fVar168;
    auVar38._0_4_ = fVar75 * fVar151;
    auVar38._8_4_ = fVar75 * fVar170;
    auVar38._12_4_ = fVar169 * fVar172;
    auVar38._16_4_ = fVar75 * 0.0;
    auVar38._20_4_ = fVar169 * 0.0;
    auVar38._24_4_ = fVar75 * 0.0;
    auVar38._28_4_ = fVar152;
    auVar5 = vfmadd231ps_fma(auVar38,auVar88,auVar166);
    local_238 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar214));
    fVar75 = auVar76._0_4_;
    fVar152 = auVar76._4_4_;
    auVar39._4_4_ = fVar152 * fVar168;
    auVar39._0_4_ = fVar75 * fVar151;
    auVar39._8_4_ = fVar75 * fVar170;
    auVar39._12_4_ = fVar152 * fVar172;
    auVar39._16_4_ = fVar75 * 0.0;
    auVar39._20_4_ = fVar152 * 0.0;
    auVar39._24_4_ = fVar75 * 0.0;
    auVar39._28_4_ = local_238._28_4_;
    auVar10 = vfmadd231ps_fma(auVar39,auVar88,auVar258);
    _local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar275));
    auVar21 = _local_408;
    auVar40._4_4_ = fVar168 * fStack_464;
    auVar40._0_4_ = fVar151 * local_468;
    auVar40._8_4_ = fVar170 * local_468;
    auVar40._12_4_ = fVar172 * fStack_464;
    auVar40._16_4_ = local_468 * 0.0;
    auVar40._20_4_ = fStack_464 * 0.0;
    auVar40._24_4_ = local_468 * 0.0;
    auVar40._28_4_ = fVar188;
    auVar76 = vfmadd231ps_fma(auVar40,auVar88,auVar280);
    auVar41._28_4_ = fVar152;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * auVar4._12_4_,
                            CONCAT48(fVar170 * auVar4._8_4_,
                                     CONCAT44(fVar168 * auVar4._4_4_,fVar151 * auVar4._0_4_))));
    auVar276 = vfmadd231ps_fma(auVar41,auVar88,ZEXT1632(auVar276));
    auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar5._12_4_,
                                                 CONCAT48(fVar170 * auVar5._8_4_,
                                                          CONCAT44(fVar168 * auVar5._4_4_,
                                                                   fVar151 * auVar5._0_4_)))),
                              auVar88,ZEXT1632(auVar16));
    local_468 = auVar214._0_4_ + fVar150;
    fStack_464 = auVar214._4_4_ + fVar167;
    fStack_460 = auVar214._8_4_ + fStack_460;
    fStack_45c = auVar214._12_4_ + fStack_45c;
    fStack_458 = fStack_458 + 0.0;
    fStack_454 = fStack_454 + 0.0;
    fStack_450 = fStack_450 + 0.0;
    uStack_44c = 0x40400000;
    auVar42._28_4_ = 0x40400000;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(auVar76._12_4_ * fVar172,
                            CONCAT48(auVar76._8_4_ * fVar170,
                                     CONCAT44(auVar76._4_4_ * fVar168,auVar76._0_4_ * fVar151))));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar10._12_4_,
                                                CONCAT48(fVar170 * auVar10._8_4_,
                                                         CONCAT44(fVar168 * auVar10._4_4_,
                                                                  fVar151 * auVar10._0_4_)))),
                             auVar88,ZEXT1632(auVar4));
    auVar5 = vfmadd231ps_fma(auVar42,auVar88,ZEXT1632(auVar5));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar4._12_4_,
                                                 CONCAT48(fVar170 * auVar4._8_4_,
                                                          CONCAT44(fVar168 * auVar4._4_4_,
                                                                   fVar151 * auVar4._0_4_)))),
                              auVar88,ZEXT1632(auVar276));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar172 * auVar5._12_4_,
                                                 CONCAT48(fVar170 * auVar5._8_4_,
                                                          CONCAT44(fVar168 * auVar5._4_4_,
                                                                   fVar151 * auVar5._0_4_)))),
                              ZEXT1632(auVar16),auVar88);
    auVar88 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar276));
    auVar17 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar16));
    fVar151 = fVar90 * auVar88._0_4_ * 3.0;
    fVar168 = fVar90 * auVar88._4_4_ * 3.0;
    auVar43._4_4_ = fVar168;
    auVar43._0_4_ = fVar151;
    fVar170 = fVar90 * auVar88._8_4_ * 3.0;
    auVar43._8_4_ = fVar170;
    fVar172 = fVar90 * auVar88._12_4_ * 3.0;
    auVar43._12_4_ = fVar172;
    fVar150 = fVar90 * auVar88._16_4_ * 3.0;
    auVar43._16_4_ = fVar150;
    fVar167 = fVar90 * auVar88._20_4_ * 3.0;
    auVar43._20_4_ = fVar167;
    fVar169 = fVar90 * auVar88._24_4_ * 3.0;
    auVar43._24_4_ = fVar169;
    auVar43._28_4_ = 0x40400000;
    auVar207._0_4_ = fVar90 * auVar17._0_4_ * 3.0;
    auVar207._4_4_ = fVar90 * auVar17._4_4_ * 3.0;
    auVar207._8_4_ = fVar90 * auVar17._8_4_ * 3.0;
    auVar207._12_4_ = fVar90 * auVar17._12_4_ * 3.0;
    auVar207._16_4_ = fVar90 * auVar17._16_4_ * 3.0;
    auVar207._20_4_ = fVar90 * auVar17._20_4_ * 3.0;
    auVar207._24_4_ = fVar90 * auVar17._24_4_ * 3.0;
    auVar207._28_4_ = 0;
    local_448 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar10));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar76));
    auVar88 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar214));
    auVar17 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar275));
    auVar19 = vsubps_avx(local_448,local_238);
    fVar171 = auVar88._0_4_ + auVar19._0_4_;
    fVar251 = auVar88._4_4_ + auVar19._4_4_;
    fVar261 = auVar88._8_4_ + auVar19._8_4_;
    fVar262 = auVar88._12_4_ + auVar19._12_4_;
    fVar263 = auVar88._16_4_ + auVar19._16_4_;
    fVar189 = auVar88._20_4_ + auVar19._20_4_;
    fVar190 = auVar88._24_4_ + auVar19._24_4_;
    auVar20 = vsubps_avx(local_78,_local_408);
    auVar273._0_4_ = auVar17._0_4_ + auVar20._0_4_;
    auVar273._4_4_ = auVar17._4_4_ + auVar20._4_4_;
    auVar273._8_4_ = auVar17._8_4_ + auVar20._8_4_;
    auVar273._12_4_ = auVar17._12_4_ + auVar20._12_4_;
    auVar273._16_4_ = auVar17._16_4_ + auVar20._16_4_;
    auVar273._20_4_ = auVar17._20_4_ + auVar20._20_4_;
    auVar273._24_4_ = auVar17._24_4_ + auVar20._24_4_;
    auVar273._28_4_ = auVar17._28_4_ + auVar20._28_4_;
    fVar90 = auVar275._0_4_;
    local_158 = fVar90 + (float)local_3d8._0_4_;
    fVar75 = auVar275._4_4_;
    fStack_154 = fVar75 + (float)local_3d8._4_4_;
    fVar152 = auVar275._8_4_;
    fStack_150 = fVar152 + fStack_3d0;
    fVar188 = auVar275._12_4_;
    fStack_14c = fVar188 + fStack_3cc;
    fStack_148 = fStack_3c8 + 0.0;
    fStack_144 = fStack_3c4 + 0.0;
    fStack_140 = fStack_3c0 + 0.0;
    fStack_13c = auVar18._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar214);
    auVar17 = vsubps_avx(local_98,auVar34);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    local_b8 = ZEXT1632(auVar275);
    auVar17 = vsubps_avx(local_b8,_local_3d8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    local_f8._0_4_ = auVar10._0_4_ + fVar151;
    local_f8._4_4_ = auVar10._4_4_ + fVar168;
    local_f8._8_4_ = auVar10._8_4_ + fVar170;
    local_f8._12_4_ = auVar10._12_4_ + fVar172;
    local_f8._16_4_ = fVar150 + 0.0;
    local_f8._20_4_ = fVar167 + 0.0;
    local_f8._24_4_ = fVar169 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar259 = ZEXT1632(auVar10);
    auVar17 = vsubps_avx(auVar259,auVar43);
    _local_3d8 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    fVar151 = auVar76._0_4_;
    local_138._0_4_ = fVar151 + auVar207._0_4_;
    fVar168 = auVar76._4_4_;
    local_138._4_4_ = fVar168 + auVar207._4_4_;
    fVar170 = auVar76._8_4_;
    local_138._8_4_ = fVar170 + auVar207._8_4_;
    fVar172 = auVar76._12_4_;
    local_138._12_4_ = fVar172 + auVar207._12_4_;
    local_138._16_4_ = auVar207._16_4_ + 0.0;
    local_138._20_4_ = auVar207._20_4_ + 0.0;
    local_138._24_4_ = auVar207._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar17 = vsubps_avx(ZEXT1632(auVar76),auVar207);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    auVar44._4_4_ = fVar75 * fVar251;
    auVar44._0_4_ = fVar90 * fVar171;
    auVar44._8_4_ = fVar152 * fVar261;
    auVar44._12_4_ = fVar188 * fVar262;
    auVar44._16_4_ = fVar263 * 0.0;
    auVar44._20_4_ = fVar189 * 0.0;
    auVar44._24_4_ = fVar190 * 0.0;
    auVar44._28_4_ = auVar17._28_4_;
    auVar16 = vfnmadd231ps_fma(auVar44,local_98,auVar273);
    auVar45._4_4_ = fStack_154 * fVar251;
    auVar45._0_4_ = local_158 * fVar171;
    auVar45._8_4_ = fStack_150 * fVar261;
    auVar45._12_4_ = fStack_14c * fVar262;
    auVar45._16_4_ = fStack_148 * fVar263;
    auVar45._20_4_ = fStack_144 * fVar189;
    auVar45._24_4_ = fStack_140 * fVar190;
    auVar45._28_4_ = local_3d8._28_4_;
    auVar58._4_4_ = fStack_464;
    auVar58._0_4_ = local_468;
    auVar58._8_4_ = fStack_460;
    auVar58._12_4_ = fStack_45c;
    auVar58._16_4_ = fStack_458;
    auVar58._20_4_ = fStack_454;
    auVar58._24_4_ = fStack_450;
    auVar58._28_4_ = 0x40400000;
    auVar4 = vfnmadd231ps_fma(auVar45,auVar273,auVar58);
    auVar46._4_4_ = local_178._4_4_ * fVar251;
    auVar46._0_4_ = local_178._0_4_ * fVar171;
    auVar46._8_4_ = local_178._8_4_ * fVar261;
    auVar46._12_4_ = local_178._12_4_ * fVar262;
    auVar46._16_4_ = local_178._16_4_ * fVar263;
    auVar46._20_4_ = local_178._20_4_ * fVar189;
    auVar46._24_4_ = local_178._24_4_ * fVar190;
    auVar46._28_4_ = fStack_13c;
    auVar276 = vfnmadd231ps_fma(auVar46,local_d8,auVar273);
    auVar47._4_4_ = fVar251 * (float)local_408._4_4_;
    auVar47._0_4_ = fVar171 * (float)local_408._0_4_;
    auVar47._8_4_ = fVar261 * (float)uStack_400;
    auVar47._12_4_ = fVar262 * uStack_400._4_4_;
    auVar47._16_4_ = fVar263 * (float)uStack_3f8;
    auVar47._20_4_ = fVar189 * uStack_3f8._4_4_;
    auVar47._24_4_ = fVar190 * (float)uStack_3f0;
    auVar47._28_4_ = local_178._28_4_;
    auVar5 = vfnmadd231ps_fma(auVar47,local_238,auVar273);
    auVar63._4_4_ = fVar168 * fVar251;
    auVar63._0_4_ = fVar151 * fVar171;
    auVar63._8_4_ = fVar170 * fVar261;
    auVar63._12_4_ = fVar172 * fVar262;
    auVar63._16_4_ = fVar263 * 0.0;
    auVar63._20_4_ = fVar189 * 0.0;
    auVar63._24_4_ = fVar190 * 0.0;
    auVar63._28_4_ = DAT_0205d4a0._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar63,auVar259,auVar273);
    auVar48._4_4_ = local_138._4_4_ * fVar251;
    auVar48._0_4_ = local_138._0_4_ * fVar171;
    auVar48._8_4_ = local_138._8_4_ * fVar261;
    auVar48._12_4_ = local_138._12_4_ * fVar262;
    auVar48._16_4_ = local_138._16_4_ * fVar263;
    auVar48._20_4_ = local_138._20_4_ * fVar189;
    auVar48._24_4_ = local_138._24_4_ * fVar190;
    auVar48._28_4_ = local_238._28_4_;
    auVar191 = vfnmadd231ps_fma(auVar48,local_f8,auVar273);
    auVar49._4_4_ = local_118._4_4_ * fVar251;
    auVar49._0_4_ = local_118._0_4_ * fVar171;
    auVar49._8_4_ = local_118._8_4_ * fVar261;
    auVar49._12_4_ = local_118._12_4_ * fVar262;
    auVar49._16_4_ = local_118._16_4_ * fVar263;
    auVar49._20_4_ = local_118._20_4_ * fVar189;
    auVar49._24_4_ = local_118._24_4_ * fVar190;
    auVar49._28_4_ = local_d8._28_4_;
    auVar214 = vfnmadd231ps_fma(auVar49,auVar273,_local_3d8);
    auVar50._4_4_ = local_78._4_4_ * fVar251;
    auVar50._0_4_ = local_78._0_4_ * fVar171;
    auVar50._8_4_ = local_78._8_4_ * fVar261;
    auVar50._12_4_ = local_78._12_4_ * fVar262;
    auVar50._16_4_ = local_78._16_4_ * fVar263;
    auVar50._20_4_ = local_78._20_4_ * fVar189;
    auVar50._24_4_ = local_78._24_4_ * fVar190;
    auVar50._28_4_ = auVar88._28_4_ + auVar19._28_4_;
    auVar275 = vfnmadd231ps_fma(auVar50,auVar273,local_448);
    auVar17 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar4));
    auVar88 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar4));
    auVar18 = vminps_avx(ZEXT1632(auVar276),ZEXT1632(auVar5));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar276),ZEXT1632(auVar5));
    auVar88 = vmaxps_avx(auVar88,auVar17);
    auVar19 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar191));
    auVar17 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar191));
    auVar20 = vminps_avx(ZEXT1632(auVar214),ZEXT1632(auVar275));
    auVar19 = vminps_avx(auVar19,auVar20);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(ZEXT1632(auVar214),ZEXT1632(auVar275));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar88,auVar17);
    auVar62._4_4_ = fStack_194;
    auVar62._0_4_ = local_198;
    auVar62._8_4_ = fStack_190;
    auVar62._12_4_ = fStack_18c;
    auVar62._16_4_ = fStack_188;
    auVar62._20_4_ = fStack_184;
    auVar62._24_4_ = fStack_180;
    auVar62._28_4_ = fStack_17c;
    auVar88 = vcmpps_avx(auVar19,auVar62,2);
    auVar61._4_4_ = fStack_1b4;
    auVar61._0_4_ = local_1b8;
    auVar61._8_4_ = fStack_1b0;
    auVar61._12_4_ = fStack_1ac;
    auVar61._16_4_ = fStack_1a8;
    auVar61._20_4_ = fStack_1a4;
    auVar61._24_4_ = fStack_1a0;
    auVar61._28_4_ = fStack_19c;
    auVar17 = vcmpps_avx(auVar17,auVar61,5);
    auVar88 = vandps_avx(auVar17,auVar88);
    auVar17 = local_218 & auVar88;
    uVar65 = 0;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar17 = vsubps_avx(local_238,local_98);
      auVar18 = vsubps_avx(local_448,auVar259);
      fVar167 = auVar17._0_4_ + auVar18._0_4_;
      fVar169 = auVar17._4_4_ + auVar18._4_4_;
      fVar171 = auVar17._8_4_ + auVar18._8_4_;
      fVar251 = auVar17._12_4_ + auVar18._12_4_;
      fVar261 = auVar17._16_4_ + auVar18._16_4_;
      fVar262 = auVar17._20_4_ + auVar18._20_4_;
      fVar263 = auVar17._24_4_ + auVar18._24_4_;
      auVar19 = vsubps_avx(_local_408,local_b8);
      auVar20 = vsubps_avx(local_78,ZEXT1632(auVar76));
      auVar104._0_4_ = auVar19._0_4_ + auVar20._0_4_;
      auVar104._4_4_ = auVar19._4_4_ + auVar20._4_4_;
      auVar104._8_4_ = auVar19._8_4_ + auVar20._8_4_;
      auVar104._12_4_ = auVar19._12_4_ + auVar20._12_4_;
      auVar104._16_4_ = auVar19._16_4_ + auVar20._16_4_;
      auVar104._20_4_ = auVar19._20_4_ + auVar20._20_4_;
      auVar104._24_4_ = auVar19._24_4_ + auVar20._24_4_;
      fVar150 = auVar20._28_4_;
      auVar104._28_4_ = auVar19._28_4_ + fVar150;
      auVar281._0_4_ = fVar90 * fVar167;
      auVar281._4_4_ = fVar75 * fVar169;
      auVar281._8_4_ = fVar152 * fVar171;
      auVar281._12_4_ = fVar188 * fVar251;
      auVar281._16_4_ = fVar261 * 0.0;
      auVar281._20_4_ = fVar262 * 0.0;
      auVar281._24_4_ = fVar263 * 0.0;
      auVar281._28_4_ = 0;
      auVar10 = vfnmadd231ps_fma(auVar281,auVar104,local_98);
      auVar51._4_4_ = fVar169 * fStack_154;
      auVar51._0_4_ = fVar167 * local_158;
      auVar51._8_4_ = fVar171 * fStack_150;
      auVar51._12_4_ = fVar251 * fStack_14c;
      auVar51._16_4_ = fVar261 * fStack_148;
      auVar51._20_4_ = fVar262 * fStack_144;
      auVar51._24_4_ = fVar263 * fStack_140;
      auVar51._28_4_ = fVar150;
      auVar59._4_4_ = fStack_464;
      auVar59._0_4_ = local_468;
      auVar59._8_4_ = fStack_460;
      auVar59._12_4_ = fStack_45c;
      auVar59._16_4_ = fStack_458;
      auVar59._20_4_ = fStack_454;
      auVar59._24_4_ = fStack_450;
      auVar59._28_4_ = 0x40400000;
      auVar16 = vfnmadd213ps_fma(auVar59,auVar104,auVar51);
      auVar52._4_4_ = fVar169 * local_178._4_4_;
      auVar52._0_4_ = fVar167 * local_178._0_4_;
      auVar52._8_4_ = fVar171 * local_178._8_4_;
      auVar52._12_4_ = fVar251 * local_178._12_4_;
      auVar52._16_4_ = fVar261 * local_178._16_4_;
      auVar52._20_4_ = fVar262 * local_178._20_4_;
      auVar52._24_4_ = fVar263 * local_178._24_4_;
      auVar52._28_4_ = fVar150;
      auVar4 = vfnmadd213ps_fma(local_d8,auVar104,auVar52);
      auVar53._4_4_ = (float)local_408._4_4_ * fVar169;
      auVar53._0_4_ = (float)local_408._0_4_ * fVar167;
      auVar53._8_4_ = (float)uStack_400 * fVar171;
      auVar53._12_4_ = uStack_400._4_4_ * fVar251;
      auVar53._16_4_ = (float)uStack_3f8 * fVar261;
      auVar53._20_4_ = uStack_3f8._4_4_ * fVar262;
      auVar53._24_4_ = (float)uStack_3f0 * fVar263;
      auVar53._28_4_ = fVar150;
      auVar76 = vfnmadd231ps_fma(auVar53,auVar104,local_238);
      auVar119._0_4_ = fVar151 * fVar167;
      auVar119._4_4_ = fVar168 * fVar169;
      auVar119._8_4_ = fVar170 * fVar171;
      auVar119._12_4_ = fVar172 * fVar251;
      auVar119._16_4_ = fVar261 * 0.0;
      auVar119._20_4_ = fVar262 * 0.0;
      auVar119._24_4_ = fVar263 * 0.0;
      auVar119._28_4_ = 0;
      auVar191 = vfnmadd231ps_fma(auVar119,auVar104,auVar259);
      auVar54._4_4_ = fVar169 * local_138._4_4_;
      auVar54._0_4_ = fVar167 * local_138._0_4_;
      auVar54._8_4_ = fVar171 * local_138._8_4_;
      auVar54._12_4_ = fVar251 * local_138._12_4_;
      auVar54._16_4_ = fVar261 * local_138._16_4_;
      auVar54._20_4_ = fVar262 * local_138._20_4_;
      auVar54._24_4_ = fVar263 * local_138._24_4_;
      auVar54._28_4_ = local_408._28_4_;
      auVar276 = vfnmadd213ps_fma(local_f8,auVar104,auVar54);
      auVar55._4_4_ = fVar169 * local_118._4_4_;
      auVar55._0_4_ = fVar167 * local_118._0_4_;
      auVar55._8_4_ = fVar171 * local_118._8_4_;
      auVar55._12_4_ = fVar251 * local_118._12_4_;
      auVar55._16_4_ = fVar261 * local_118._16_4_;
      auVar55._20_4_ = fVar262 * local_118._20_4_;
      auVar55._24_4_ = fVar263 * local_118._24_4_;
      auVar55._28_4_ = local_408._28_4_;
      auVar5 = vfnmadd213ps_fma(_local_3d8,auVar104,auVar55);
      auVar56._4_4_ = local_78._4_4_ * fVar169;
      auVar56._0_4_ = local_78._0_4_ * fVar167;
      auVar56._8_4_ = local_78._8_4_ * fVar171;
      auVar56._12_4_ = local_78._12_4_ * fVar251;
      auVar56._16_4_ = local_78._16_4_ * fVar261;
      auVar56._20_4_ = local_78._20_4_ * fVar262;
      auVar56._24_4_ = local_78._24_4_ * fVar263;
      auVar56._28_4_ = auVar17._28_4_ + auVar18._28_4_;
      auVar214 = vfnmadd231ps_fma(auVar56,auVar104,local_448);
      auVar18 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar16));
      auVar17 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar16));
      auVar19 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar76));
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar76));
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar20 = vminps_avx(ZEXT1632(auVar191),ZEXT1632(auVar276));
      auVar18 = vmaxps_avx(ZEXT1632(auVar191),ZEXT1632(auVar276));
      auVar259 = vminps_avx(ZEXT1632(auVar5),ZEXT1632(auVar214));
      auVar20 = vminps_avx(auVar20,auVar259);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar214));
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vcmpps_avx(auVar20,auVar62,2);
      auVar18 = vcmpps_avx(auVar18,auVar61,5);
      auVar17 = vandps_avx(auVar18,auVar17);
      auVar88 = vandps_avx(auVar88,local_218);
      auVar18 = auVar88 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar88 = vandps_avx(auVar17,auVar88);
        uVar65 = vmovmskps_avx(auVar88);
      }
    }
    _local_408 = auVar21;
    if (uVar65 != 0) {
      auStack_308[uVar67] = uVar65;
      uVar173 = vmovlps_avx(local_288);
      *(undefined8 *)(&uStack_1f8 + uVar67 * 2) = uVar173;
      uVar73 = vmovlps_avx(local_4c8);
      auStack_58[uVar67] = uVar73;
      uVar67 = (ulong)((int)uVar67 + 1);
    }
    do {
      if ((int)uVar67 == 0) {
        fVar151 = (ray->super_RayK<1>).tfar;
        auVar89._4_4_ = fVar151;
        auVar89._0_4_ = fVar151;
        auVar89._8_4_ = fVar151;
        auVar89._12_4_ = fVar151;
        auVar89._16_4_ = fVar151;
        auVar89._20_4_ = fVar151;
        auVar89._24_4_ = fVar151;
        auVar89._28_4_ = fVar151;
        auVar88 = vcmpps_avx(local_1d8,auVar89,2);
        uVar64 = vmovmskps_avx(auVar88);
        uVar64 = (uint)uVar70 & uVar64;
        if (uVar64 == 0) {
          return;
        }
        goto LAB_018afe3f;
      }
      uVar66 = (int)uVar67 - 1;
      uVar68 = (ulong)uVar66;
      uVar72 = auStack_308[uVar68];
      uVar65 = (&uStack_1f8)[uVar68 * 2];
      fVar151 = afStack_1f4[uVar68 * 2];
      iVar24 = 0;
      for (uVar73 = (ulong)uVar72; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        iVar24 = iVar24 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      if (uVar72 == 0) {
        uVar67 = (ulong)uVar66;
      }
      local_4c8._8_8_ = 0;
      local_4c8._0_8_ = auStack_58[uVar68];
      auStack_308[uVar68] = uVar72;
      fVar168 = (float)(iVar24 + 1) * 0.14285715;
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * (float)iVar24 * 0.14285715)),
                                ZEXT416(uVar65),ZEXT416((uint)(1.0 - (float)iVar24 * 0.14285715)));
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar168)),ZEXT416(uVar65),
                               ZEXT416((uint)(1.0 - fVar168)));
      auVar282 = ZEXT1664(auVar4);
      fVar168 = auVar16._0_4_;
      local_468 = auVar4._0_4_;
      fVar151 = local_468 - fVar168;
      local_448._0_16_ = auVar16;
      fStack_464 = auVar4._4_4_;
      fStack_460 = auVar4._8_4_;
      fStack_45c = auVar4._12_4_;
      if (0.16666667 <= fVar151) break;
      auVar276 = vshufps_avx(local_4c8,local_4c8,0x50);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar5 = vsubps_avx(auVar108,auVar276);
      fVar170 = auVar276._0_4_;
      auVar124._0_4_ = fVar134 * fVar170;
      fVar172 = auVar276._4_4_;
      auVar124._4_4_ = fVar135 * fVar172;
      fVar90 = auVar276._8_4_;
      auVar124._8_4_ = fVar134 * fVar90;
      fVar75 = auVar276._12_4_;
      auVar124._12_4_ = fVar135 * fVar75;
      auVar138._0_4_ = fVar264 * fVar170;
      auVar138._4_4_ = fVar274 * fVar172;
      auVar138._8_4_ = fVar264 * fVar90;
      auVar138._12_4_ = fVar274 * fVar75;
      auVar158._0_4_ = fVar231 * fVar170;
      auVar158._4_4_ = fVar241 * fVar172;
      auVar158._8_4_ = fVar231 * fVar90;
      auVar158._12_4_ = fVar241 * fVar75;
      auVar95._0_4_ = fVar121 * fVar170;
      auVar95._4_4_ = fVar133 * fVar172;
      auVar95._8_4_ = fVar121 * fVar90;
      auVar95._12_4_ = fVar133 * fVar75;
      auVar276 = vfmadd231ps_fma(auVar124,auVar5,auVar285);
      auVar10 = vfmadd231ps_fma(auVar138,auVar5,auVar211);
      auVar76 = vfmadd231ps_fma(auVar158,auVar5,auVar94);
      auVar5 = vfmadd231ps_fma(auVar95,auVar107,auVar5);
      auVar120._16_16_ = auVar276;
      auVar120._0_16_ = auVar276;
      auVar131._16_16_ = auVar10;
      auVar131._0_16_ = auVar10;
      auVar149._16_16_ = auVar76;
      auVar149._0_16_ = auVar76;
      auVar187._4_4_ = fVar168;
      auVar187._0_4_ = fVar168;
      auVar187._8_4_ = fVar168;
      auVar187._12_4_ = fVar168;
      auVar187._20_4_ = local_468;
      auVar187._16_4_ = local_468;
      auVar187._24_4_ = local_468;
      auVar187._28_4_ = local_468;
      auVar88 = vsubps_avx(auVar131,auVar120);
      auVar10 = vfmadd213ps_fma(auVar88,auVar187,auVar120);
      auVar88 = vsubps_avx(auVar149,auVar131);
      auVar191 = vfmadd213ps_fma(auVar88,auVar187,auVar131);
      auVar276 = vsubps_avx(auVar5,auVar76);
      auVar132._16_16_ = auVar276;
      auVar132._0_16_ = auVar276;
      auVar276 = vfmadd213ps_fma(auVar132,auVar187,auVar149);
      auVar88 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar10));
      auVar5 = vfmadd213ps_fma(auVar88,auVar187,ZEXT1632(auVar10));
      auVar88 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar191));
      auVar276 = vfmadd213ps_fma(auVar88,auVar187,ZEXT1632(auVar191));
      auVar88 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar5));
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar88,auVar187);
      fVar188 = auVar88._4_4_ * 3.0;
      fVar152 = fVar151 * 0.33333334;
      local_238._0_8_ =
           CONCAT44(auVar77._4_4_ + fVar152 * fVar188,auVar77._0_4_ + fVar152 * auVar88._0_4_ * 3.0)
      ;
      local_238._8_4_ = auVar77._8_4_ + fVar152 * auVar88._8_4_ * 3.0;
      local_238._12_4_ = auVar77._12_4_ + fVar152 * auVar88._12_4_ * 3.0;
      auVar5 = vshufpd_avx(auVar77,auVar77,3);
      auVar10 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_3d8 = auVar5;
      auVar276 = vsubps_avx(auVar5,auVar77);
      _local_408 = auVar10;
      auVar76 = vsubps_avx(auVar10,(undefined1  [16])0x0);
      auVar109._0_4_ = auVar276._0_4_ + auVar76._0_4_;
      auVar109._4_4_ = auVar276._4_4_ + auVar76._4_4_;
      auVar109._8_4_ = auVar276._8_4_ + auVar76._8_4_;
      auVar109._12_4_ = auVar276._12_4_ + auVar76._12_4_;
      auVar276 = vshufps_avx(auVar77,auVar77,0xb1);
      auVar76 = vshufps_avx(local_238._0_16_,local_238._0_16_,0xb1);
      auVar266._4_4_ = auVar109._0_4_;
      auVar266._0_4_ = auVar109._0_4_;
      auVar266._8_4_ = auVar109._0_4_;
      auVar266._12_4_ = auVar109._0_4_;
      auVar191 = vshufps_avx(auVar109,auVar109,0x55);
      fVar170 = auVar191._0_4_;
      auVar195._0_4_ = auVar276._0_4_ * fVar170;
      fVar172 = auVar191._4_4_;
      auVar195._4_4_ = auVar276._4_4_ * fVar172;
      fVar90 = auVar191._8_4_;
      auVar195._8_4_ = auVar276._8_4_ * fVar90;
      fVar75 = auVar191._12_4_;
      auVar195._12_4_ = auVar276._12_4_ * fVar75;
      auVar212._0_4_ = auVar76._0_4_ * fVar170;
      auVar212._4_4_ = auVar76._4_4_ * fVar172;
      auVar212._8_4_ = auVar76._8_4_ * fVar90;
      auVar212._12_4_ = auVar76._12_4_ * fVar75;
      auVar214 = vfmadd231ps_fma(auVar195,auVar266,auVar77);
      auVar275 = vfmadd231ps_fma(auVar212,auVar266,local_238._0_16_);
      auVar76 = vshufps_avx(auVar214,auVar214,0xe8);
      auVar191 = vshufps_avx(auVar275,auVar275,0xe8);
      auVar276 = vcmpps_avx(auVar76,auVar191,1);
      uVar65 = vextractps_avx(auVar276,0);
      auVar78 = auVar275;
      if ((uVar65 & 1) == 0) {
        auVar78 = auVar214;
      }
      auVar139._0_4_ = fVar152 * auVar88._16_4_ * 3.0;
      auVar139._4_4_ = fVar152 * fVar188;
      auVar139._8_4_ = fVar152 * auVar88._24_4_ * 3.0;
      auVar139._12_4_ = fVar152 * local_468;
      auVar81 = vsubps_avx((undefined1  [16])0x0,auVar139);
      auVar140 = vshufps_avx(auVar81,auVar81,0xb1);
      auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar286._0_4_ = auVar140._0_4_ * fVar170;
      auVar286._4_4_ = auVar140._4_4_ * fVar172;
      auVar286._8_4_ = auVar140._8_4_ * fVar90;
      auVar286._12_4_ = auVar140._12_4_ * fVar75;
      auVar110._0_4_ = auVar79._0_4_ * fVar170;
      auVar110._4_4_ = auVar79._4_4_ * fVar172;
      auVar110._8_4_ = auVar79._8_4_ * fVar90;
      auVar110._12_4_ = auVar79._12_4_ * fVar75;
      auVar82 = vfmadd231ps_fma(auVar286,auVar266,auVar81);
      auVar83 = vfmadd231ps_fma(auVar110,(undefined1  [16])0x0,auVar266);
      auVar79 = vshufps_avx(auVar82,auVar82,0xe8);
      auVar80 = vshufps_avx(auVar83,auVar83,0xe8);
      auVar140 = vcmpps_avx(auVar79,auVar80,1);
      uVar65 = vextractps_avx(auVar140,0);
      auVar84 = auVar83;
      if ((uVar65 & 1) == 0) {
        auVar84 = auVar82;
      }
      auVar78 = vmaxss_avx(auVar84,auVar78);
      auVar76 = vminps_avx(auVar76,auVar191);
      auVar191 = vminps_avx(auVar79,auVar80);
      auVar191 = vminps_avx(auVar76,auVar191);
      auVar276 = vshufps_avx(auVar276,auVar276,0x55);
      auVar276 = vblendps_avx(auVar276,auVar140,2);
      auVar140 = vpslld_avx(auVar276,0x1f);
      auVar276 = vshufpd_avx(auVar275,auVar275,1);
      auVar276 = vinsertps_avx(auVar276,auVar83,0x9c);
      auVar76 = vshufpd_avx(auVar214,auVar214,1);
      auVar76 = vinsertps_avx(auVar76,auVar82,0x9c);
      auVar276 = vblendvps_avx(auVar76,auVar276,auVar140);
      auVar76 = vmovshdup_avx(auVar276);
      auVar276 = vmaxss_avx(auVar76,auVar276);
      fVar90 = auVar191._0_4_;
      auVar76 = vmovshdup_avx(auVar191);
      fVar172 = auVar276._0_4_;
      fVar170 = auVar78._0_4_;
      if ((0.0001 <= fVar90) || (fVar172 <= -0.0001)) {
        auVar214 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar275 = vcmpps_avx(auVar191,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar214 = vorps_avx(auVar275,auVar214);
        if ((-0.0001 < fVar170 & auVar214[0]) != 0) goto LAB_018b0ebd;
        auVar214 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar276,5);
        auVar275 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar214 = vorps_avx(auVar275,auVar214);
        if ((auVar214 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_018b0ebd;
LAB_018b196a:
        bVar57 = true;
      }
      else {
LAB_018b0ebd:
        auVar275 = vcmpps_avx(auVar191,_DAT_01feba10,1);
        auVar140 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar214 = vcmpss_avx(auVar78,ZEXT816(0) << 0x20,1);
        auVar159._8_4_ = 0x3f800000;
        auVar159._0_8_ = &DAT_3f8000003f800000;
        auVar159._12_4_ = 0x3f800000;
        auVar213._8_4_ = 0xbf800000;
        auVar213._0_8_ = 0xbf800000bf800000;
        auVar213._12_4_ = 0xbf800000;
        auVar214 = vblendvps_avx(auVar159,auVar213,auVar214);
        auVar275 = vblendvps_avx(auVar159,auVar213,auVar275);
        fVar75 = auVar275._0_4_;
        fVar152 = auVar214._0_4_;
        auVar214 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar79 = ZEXT816(0) << 0x20;
        if ((fVar75 == fVar152) && (!NAN(fVar75) && !NAN(fVar152))) {
          auVar214 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar75 == fVar152) && (!NAN(fVar75) && !NAN(fVar152))) {
          auVar140 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar275 = vmovshdup_avx(auVar275);
        fVar188 = auVar275._0_4_;
        if ((fVar75 != fVar188) || (NAN(fVar75) || NAN(fVar188))) {
          fVar75 = auVar76._0_4_;
          if ((fVar75 != fVar90) || (NAN(fVar75) || NAN(fVar90))) {
            auVar111._0_8_ = auVar191._0_8_ ^ 0x8000000080000000;
            auVar111._8_4_ = auVar191._8_4_ ^ 0x80000000;
            auVar111._12_4_ = auVar191._12_4_ ^ 0x80000000;
            auVar141._0_4_ = -fVar90 / (fVar75 - fVar90);
            auVar141._4_12_ = auVar111._4_12_;
            auVar76 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar141._0_4_)),auVar79,auVar141);
            auVar191 = auVar76;
          }
          else {
            auVar76 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar90 == 0.0) && (auVar76 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar90))) {
              auVar76 = ZEXT816(0);
            }
            auVar191 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar90 == 0.0) && (auVar191 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar90))) {
              auVar191 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar214 = vminss_avx(auVar214,auVar76);
          auVar140 = vmaxss_avx(auVar191,auVar140);
        }
        auVar276 = vcmpss_avx(auVar276,auVar79,1);
        auVar142._8_4_ = 0x3f800000;
        auVar142._0_8_ = &DAT_3f8000003f800000;
        auVar142._12_4_ = 0x3f800000;
        auVar160._8_4_ = 0xbf800000;
        auVar160._0_8_ = 0xbf800000bf800000;
        auVar160._12_4_ = 0xbf800000;
        auVar276 = vblendvps_avx(auVar142,auVar160,auVar276);
        fVar90 = auVar276._0_4_;
        auVar276 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar152 != fVar90) || (NAN(fVar152) || NAN(fVar90))) {
          if ((fVar172 != fVar170) || (NAN(fVar172) || NAN(fVar170))) {
            auVar112._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar112._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar112._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar143._0_4_ = -fVar170 / (fVar172 - fVar170);
            auVar143._4_12_ = auVar112._4_12_;
            auVar76 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar143._0_4_)),auVar79,auVar143);
            auVar191 = auVar76;
          }
          else {
            auVar76 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar170 == 0.0) && (auVar76 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar170))) {
              auVar76 = ZEXT816(0);
            }
            auVar191 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar170 == 0.0) && (auVar191 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar170))) {
              auVar191 = auVar276;
            }
          }
          auVar214 = vminss_avx(auVar214,auVar76);
          auVar140 = vmaxss_avx(auVar191,auVar140);
        }
        if ((fVar188 != fVar90) || (NAN(fVar188) || NAN(fVar90))) {
          auVar214 = vminss_avx(auVar214,auVar276);
          auVar140 = vmaxss_avx(auVar276,auVar140);
        }
        auVar76 = vmaxss_avx(auVar79,auVar214);
        auVar191 = vminss_avx(auVar140,auVar276);
        bVar57 = true;
        if (auVar76._0_4_ <= auVar191._0_4_) {
          auVar76 = vmaxss_avx(auVar79,ZEXT416((uint)(auVar76._0_4_ + -0.1)));
          auVar276 = vminss_avx(ZEXT416((uint)(auVar191._0_4_ + 0.1)),auVar276);
          auVar96._0_8_ = auVar77._0_8_;
          auVar96._8_8_ = auVar96._0_8_;
          auVar215._8_8_ = local_238._0_8_;
          auVar215._0_8_ = local_238._0_8_;
          auVar225._8_8_ = auVar81._0_8_;
          auVar225._0_8_ = auVar81._0_8_;
          auVar191 = vshufpd_avx(local_238._0_16_,local_238._0_16_,3);
          auVar214 = vshufpd_avx(auVar81,auVar81,3);
          auVar275 = vshufps_avx(auVar76,auVar276,0);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = &DAT_3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar77 = vsubps_avx(auVar125,auVar275);
          local_3d8._0_4_ = auVar5._0_4_;
          local_3d8._4_4_ = auVar5._4_4_;
          fStack_3d0 = auVar5._8_4_;
          fStack_3cc = auVar5._12_4_;
          fVar170 = auVar275._0_4_;
          auVar126._0_4_ = fVar170 * (float)local_3d8._0_4_;
          fVar172 = auVar275._4_4_;
          auVar126._4_4_ = fVar172 * (float)local_3d8._4_4_;
          fVar90 = auVar275._8_4_;
          auVar126._8_4_ = fVar90 * fStack_3d0;
          fVar75 = auVar275._12_4_;
          auVar126._12_4_ = fVar75 * fStack_3cc;
          auVar144._0_4_ = auVar191._0_4_ * fVar170;
          auVar144._4_4_ = auVar191._4_4_ * fVar172;
          auVar144._8_4_ = auVar191._8_4_ * fVar90;
          auVar144._12_4_ = auVar191._12_4_ * fVar75;
          auVar161._0_4_ = auVar214._0_4_ * fVar170;
          auVar161._4_4_ = auVar214._4_4_ * fVar172;
          auVar161._8_4_ = auVar214._8_4_ * fVar90;
          auVar161._12_4_ = auVar214._12_4_ * fVar75;
          local_408._0_4_ = auVar10._0_4_;
          local_408._4_4_ = auVar10._4_4_;
          uStack_400._0_4_ = auVar10._8_4_;
          uStack_400._4_4_ = auVar10._12_4_;
          auVar182._0_4_ = fVar170 * (float)local_408._0_4_;
          auVar182._4_4_ = fVar172 * (float)local_408._4_4_;
          auVar182._8_4_ = fVar90 * (float)uStack_400;
          auVar182._12_4_ = fVar75 * uStack_400._4_4_;
          auVar191 = vfmadd231ps_fma(auVar126,auVar77,auVar96);
          auVar214 = vfmadd231ps_fma(auVar144,auVar77,auVar215);
          auVar275 = vfmadd231ps_fma(auVar161,auVar77,auVar225);
          auVar77 = vfmadd231ps_fma(auVar182,auVar77,ZEXT816(0));
          auVar5 = vmovshdup_avx(local_4c8);
          auVar140 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar76._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar76._0_4_)));
          auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar276._0_4_)),local_4c8,
                                    ZEXT416((uint)(1.0 - auVar276._0_4_)));
          fVar170 = 1.0 / fVar151;
          auVar276 = vsubps_avx(auVar214,auVar191);
          auVar196._0_4_ = auVar276._0_4_ * 3.0;
          auVar196._4_4_ = auVar276._4_4_ * 3.0;
          auVar196._8_4_ = auVar276._8_4_ * 3.0;
          auVar196._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar275,auVar214);
          auVar216._0_4_ = auVar276._0_4_ * 3.0;
          auVar216._4_4_ = auVar276._4_4_ * 3.0;
          auVar216._8_4_ = auVar276._8_4_ * 3.0;
          auVar216._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar77,auVar275);
          auVar226._0_4_ = auVar276._0_4_ * 3.0;
          auVar226._4_4_ = auVar276._4_4_ * 3.0;
          auVar226._8_4_ = auVar276._8_4_ * 3.0;
          auVar226._12_4_ = auVar276._12_4_ * 3.0;
          auVar5 = vminps_avx(auVar216,auVar226);
          auVar276 = vmaxps_avx(auVar216,auVar226);
          auVar5 = vminps_avx(auVar196,auVar5);
          auVar276 = vmaxps_avx(auVar196,auVar276);
          auVar10 = vshufpd_avx(auVar5,auVar5,3);
          auVar76 = vshufpd_avx(auVar276,auVar276,3);
          auVar5 = vminps_avx(auVar5,auVar10);
          auVar276 = vmaxps_avx(auVar276,auVar76);
          auVar217._0_4_ = auVar5._0_4_ * fVar170;
          auVar217._4_4_ = auVar5._4_4_ * fVar170;
          auVar217._8_4_ = auVar5._8_4_ * fVar170;
          auVar217._12_4_ = auVar5._12_4_ * fVar170;
          auVar197._0_4_ = fVar170 * auVar276._0_4_;
          auVar197._4_4_ = fVar170 * auVar276._4_4_;
          auVar197._8_4_ = fVar170 * auVar276._8_4_;
          auVar197._12_4_ = fVar170 * auVar276._12_4_;
          fVar170 = 1.0 / (auVar79._0_4_ - auVar140._0_4_);
          auVar276 = vshufpd_avx(auVar191,auVar191,3);
          auVar5 = vshufpd_avx(auVar214,auVar214,3);
          auVar10 = vshufpd_avx(auVar275,auVar275,3);
          auVar76 = vshufpd_avx(auVar77,auVar77,3);
          auVar276 = vsubps_avx(auVar276,auVar191);
          auVar191 = vsubps_avx(auVar5,auVar214);
          auVar214 = vsubps_avx(auVar10,auVar275);
          auVar76 = vsubps_avx(auVar76,auVar77);
          auVar5 = vminps_avx(auVar276,auVar191);
          auVar276 = vmaxps_avx(auVar276,auVar191);
          auVar10 = vminps_avx(auVar214,auVar76);
          auVar10 = vminps_avx(auVar5,auVar10);
          auVar5 = vmaxps_avx(auVar214,auVar76);
          auVar276 = vmaxps_avx(auVar276,auVar5);
          auVar244._0_4_ = fVar170 * auVar10._0_4_;
          auVar244._4_4_ = fVar170 * auVar10._4_4_;
          auVar244._8_4_ = fVar170 * auVar10._8_4_;
          auVar244._12_4_ = fVar170 * auVar10._12_4_;
          auVar236._0_4_ = fVar170 * auVar276._0_4_;
          auVar236._4_4_ = fVar170 * auVar276._4_4_;
          auVar236._8_4_ = fVar170 * auVar276._8_4_;
          auVar236._12_4_ = fVar170 * auVar276._12_4_;
          auVar10 = vinsertps_avx(auVar16,auVar140,0x10);
          auVar76 = vinsertps_avx(auVar4,auVar79,0x10);
          auVar87._0_4_ = (auVar10._0_4_ + auVar76._0_4_) * 0.5;
          auVar87._4_4_ = (auVar10._4_4_ + auVar76._4_4_) * 0.5;
          auVar87._8_4_ = (auVar10._8_4_ + auVar76._8_4_) * 0.5;
          auVar87._12_4_ = (auVar10._12_4_ + auVar76._12_4_) * 0.5;
          auVar127._4_4_ = auVar87._0_4_;
          auVar127._0_4_ = auVar87._0_4_;
          auVar127._8_4_ = auVar87._0_4_;
          auVar127._12_4_ = auVar87._0_4_;
          auVar4 = vfmadd213ps_fma(local_248,auVar127,local_478);
          auVar276 = vfmadd213ps_fma(local_258,auVar127,local_488);
          auVar5 = vfmadd213ps_fma(local_268,auVar127,local_498);
          auVar16 = vsubps_avx(auVar276,auVar4);
          auVar4 = vfmadd213ps_fma(auVar16,auVar127,auVar4);
          auVar16 = vsubps_avx(auVar5,auVar276);
          auVar16 = vfmadd213ps_fma(auVar16,auVar127,auVar276);
          auVar16 = vsubps_avx(auVar16,auVar4);
          auVar4 = vfmadd231ps_fma(auVar4,auVar16,auVar127);
          auVar128._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
          auVar128._8_4_ = auVar16._8_4_ * 3.0;
          auVar128._12_4_ = auVar16._12_4_ * 3.0;
          auVar227._8_8_ = auVar4._0_8_;
          auVar227._0_8_ = auVar4._0_8_;
          auVar16 = vshufpd_avx(auVar4,auVar4,3);
          auVar4 = vshufps_avx(auVar87,auVar87,0x55);
          auVar191 = vsubps_avx(auVar16,auVar227);
          auVar275 = vfmadd231ps_fma(auVar227,auVar4,auVar191);
          auVar267._8_8_ = auVar128._0_8_;
          auVar267._0_8_ = auVar128._0_8_;
          auVar16 = vshufpd_avx(auVar128,auVar128,3);
          auVar16 = vsubps_avx(auVar16,auVar267);
          auVar214 = vfmadd213ps_fma(auVar16,auVar4,auVar267);
          auVar4 = vmovshdup_avx(auVar214);
          auVar268._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
          auVar268._8_4_ = auVar4._8_4_ ^ 0x80000000;
          auVar268._12_4_ = auVar4._12_4_ ^ 0x80000000;
          auVar276 = vmovshdup_avx(auVar191);
          auVar16 = vunpcklps_avx(auVar276,auVar268);
          auVar5 = vshufps_avx(auVar16,auVar268,4);
          auVar287._0_8_ = auVar191._0_8_ ^ 0x8000000080000000;
          auVar287._8_4_ = auVar191._8_4_ ^ 0x80000000;
          auVar287._12_4_ = auVar191._12_4_ ^ 0x80000000;
          auVar16 = vmovlhps_avx(auVar287,auVar214);
          auVar16 = vshufps_avx(auVar16,auVar214,8);
          auVar4 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar191._0_4_)),auVar276,auVar214)
          ;
          auVar145._0_4_ = auVar4._0_4_;
          auVar145._4_4_ = auVar145._0_4_;
          auVar145._8_4_ = auVar145._0_4_;
          auVar145._12_4_ = auVar145._0_4_;
          auVar4 = vdivps_avx(auVar5,auVar145);
          auVar276 = vdivps_avx(auVar16,auVar145);
          fVar90 = auVar275._0_4_;
          fVar170 = auVar4._0_4_;
          auVar16 = vshufps_avx(auVar275,auVar275,0x55);
          fVar172 = auVar276._0_4_;
          local_408._4_4_ = fVar90 * auVar4._4_4_ + auVar16._4_4_ * auVar276._4_4_;
          local_408._0_4_ = fVar90 * fVar170 + auVar16._0_4_ * fVar172;
          uStack_400._0_4_ = fVar90 * auVar4._8_4_ + auVar16._8_4_ * auVar276._8_4_;
          uStack_400._4_4_ = fVar90 * auVar4._12_4_ + auVar16._12_4_ * auVar276._12_4_;
          auVar191 = vmovshdup_avx(auVar4);
          auVar16 = vinsertps_avx(auVar217,auVar244,0x1c);
          auVar277._0_4_ = auVar191._0_4_ * auVar16._0_4_;
          auVar277._4_4_ = auVar191._4_4_ * auVar16._4_4_;
          auVar277._8_4_ = auVar191._8_4_ * auVar16._8_4_;
          auVar277._12_4_ = auVar191._12_4_ * auVar16._12_4_;
          auVar5 = vinsertps_avx(auVar197,auVar236,0x1c);
          auVar253._0_4_ = auVar191._0_4_ * auVar5._0_4_;
          auVar253._4_4_ = auVar191._4_4_ * auVar5._4_4_;
          auVar253._8_4_ = auVar191._8_4_ * auVar5._8_4_;
          auVar253._12_4_ = auVar191._12_4_ * auVar5._12_4_;
          auVar77 = vminps_avx(auVar277,auVar253);
          auVar275 = vmaxps_avx(auVar253,auVar277);
          auVar191 = vinsertps_avx(auVar244,auVar217,0x4c);
          auVar78 = vmovshdup_avx(auVar276);
          auVar214 = vinsertps_avx(auVar236,auVar197,0x4c);
          auVar237._0_4_ = auVar78._0_4_ * auVar191._0_4_;
          auVar237._4_4_ = auVar78._4_4_ * auVar191._4_4_;
          auVar237._8_4_ = auVar78._8_4_ * auVar191._8_4_;
          auVar237._12_4_ = auVar78._12_4_ * auVar191._12_4_;
          auVar245._0_4_ = auVar78._0_4_ * auVar214._0_4_;
          auVar245._4_4_ = auVar78._4_4_ * auVar214._4_4_;
          auVar245._8_4_ = auVar78._8_4_ * auVar214._8_4_;
          auVar245._12_4_ = auVar78._12_4_ * auVar214._12_4_;
          auVar78 = vminps_avx(auVar237,auVar245);
          auVar97._0_4_ = auVar78._0_4_ + auVar77._0_4_;
          auVar97._4_4_ = auVar78._4_4_ + auVar77._4_4_;
          auVar97._8_4_ = auVar78._8_4_ + auVar77._8_4_;
          auVar97._12_4_ = auVar78._12_4_ + auVar77._12_4_;
          auVar77 = vmaxps_avx(auVar245,auVar237);
          auVar238._0_4_ = auVar275._0_4_ + auVar77._0_4_;
          auVar238._4_4_ = auVar275._4_4_ + auVar77._4_4_;
          auVar238._8_4_ = auVar275._8_4_ + auVar77._8_4_;
          auVar238._12_4_ = auVar275._12_4_ + auVar77._12_4_;
          auVar246._8_8_ = 0x3f80000000000000;
          auVar246._0_8_ = 0x3f80000000000000;
          auVar275 = vsubps_avx(auVar246,auVar238);
          auVar77 = vsubps_avx(auVar246,auVar97);
          auVar78 = vsubps_avx(auVar10,auVar87);
          auVar269._0_4_ = fVar170 * auVar16._0_4_;
          auVar269._4_4_ = fVar170 * auVar16._4_4_;
          auVar269._8_4_ = fVar170 * auVar16._8_4_;
          auVar269._12_4_ = fVar170 * auVar16._12_4_;
          auVar254._0_4_ = fVar170 * auVar5._0_4_;
          auVar254._4_4_ = fVar170 * auVar5._4_4_;
          auVar254._8_4_ = fVar170 * auVar5._8_4_;
          auVar254._12_4_ = fVar170 * auVar5._12_4_;
          auVar5 = vminps_avx(auVar269,auVar254);
          auVar16 = vmaxps_avx(auVar254,auVar269);
          auVar218._0_4_ = fVar172 * auVar191._0_4_;
          auVar218._4_4_ = fVar172 * auVar191._4_4_;
          auVar218._8_4_ = fVar172 * auVar191._8_4_;
          auVar218._12_4_ = fVar172 * auVar191._12_4_;
          auVar198._0_4_ = fVar172 * auVar214._0_4_;
          auVar198._4_4_ = fVar172 * auVar214._4_4_;
          auVar198._8_4_ = fVar172 * auVar214._8_4_;
          auVar198._12_4_ = fVar172 * auVar214._12_4_;
          auVar191 = vminps_avx(auVar218,auVar198);
          auVar270._0_4_ = auVar5._0_4_ + auVar191._0_4_;
          auVar270._4_4_ = auVar5._4_4_ + auVar191._4_4_;
          auVar270._8_4_ = auVar5._8_4_ + auVar191._8_4_;
          auVar270._12_4_ = auVar5._12_4_ + auVar191._12_4_;
          auVar191 = vsubps_avx(auVar76,auVar87);
          auVar5 = vmaxps_avx(auVar198,auVar218);
          fVar90 = auVar78._0_4_;
          auVar219._0_4_ = fVar90 * auVar275._0_4_;
          fVar75 = auVar78._4_4_;
          auVar219._4_4_ = fVar75 * auVar275._4_4_;
          fVar152 = auVar78._8_4_;
          auVar219._8_4_ = fVar152 * auVar275._8_4_;
          fVar188 = auVar78._12_4_;
          auVar219._12_4_ = fVar188 * auVar275._12_4_;
          auVar199._0_4_ = auVar16._0_4_ + auVar5._0_4_;
          auVar199._4_4_ = auVar16._4_4_ + auVar5._4_4_;
          auVar199._8_4_ = auVar16._8_4_ + auVar5._8_4_;
          auVar199._12_4_ = auVar16._12_4_ + auVar5._12_4_;
          auVar255._8_8_ = 0x3f800000;
          auVar255._0_8_ = 0x3f800000;
          auVar16 = vsubps_avx(auVar255,auVar199);
          auVar5 = vsubps_avx(auVar255,auVar270);
          auVar271._0_4_ = fVar90 * auVar77._0_4_;
          auVar271._4_4_ = fVar75 * auVar77._4_4_;
          auVar271._8_4_ = fVar152 * auVar77._8_4_;
          auVar271._12_4_ = fVar188 * auVar77._12_4_;
          fVar150 = auVar191._0_4_;
          auVar239._0_4_ = fVar150 * auVar275._0_4_;
          fVar167 = auVar191._4_4_;
          auVar239._4_4_ = fVar167 * auVar275._4_4_;
          fVar169 = auVar191._8_4_;
          auVar239._8_4_ = fVar169 * auVar275._8_4_;
          fVar171 = auVar191._12_4_;
          auVar239._12_4_ = fVar171 * auVar275._12_4_;
          auVar98._0_4_ = fVar150 * auVar77._0_4_;
          auVar98._4_4_ = fVar167 * auVar77._4_4_;
          auVar98._8_4_ = fVar169 * auVar77._8_4_;
          auVar98._12_4_ = fVar171 * auVar77._12_4_;
          auVar288._0_4_ = fVar90 * auVar16._0_4_;
          auVar288._4_4_ = fVar75 * auVar16._4_4_;
          auVar288._8_4_ = fVar152 * auVar16._8_4_;
          auVar288._12_4_ = fVar188 * auVar16._12_4_;
          auVar247._0_4_ = fVar90 * auVar5._0_4_;
          auVar247._4_4_ = fVar75 * auVar5._4_4_;
          auVar247._8_4_ = fVar152 * auVar5._8_4_;
          auVar247._12_4_ = fVar188 * auVar5._12_4_;
          auVar200._0_4_ = fVar150 * auVar16._0_4_;
          auVar200._4_4_ = fVar167 * auVar16._4_4_;
          auVar200._8_4_ = fVar169 * auVar16._8_4_;
          auVar200._12_4_ = fVar171 * auVar16._12_4_;
          auVar256._0_4_ = fVar150 * auVar5._0_4_;
          auVar256._4_4_ = fVar167 * auVar5._4_4_;
          auVar256._8_4_ = fVar169 * auVar5._8_4_;
          auVar256._12_4_ = fVar171 * auVar5._12_4_;
          auVar16 = vminps_avx(auVar288,auVar247);
          auVar5 = vminps_avx(auVar200,auVar256);
          auVar16 = vminps_avx(auVar16,auVar5);
          auVar5 = vmaxps_avx(auVar247,auVar288);
          auVar191 = vminps_avx(auVar219,auVar271);
          auVar214 = vminps_avx(auVar239,auVar98);
          auVar191 = vminps_avx(auVar191,auVar214);
          auVar16 = vhaddps_avx(auVar16,auVar191);
          auVar191 = vmaxps_avx(auVar256,auVar200);
          auVar5 = vmaxps_avx(auVar191,auVar5);
          auVar191 = vmaxps_avx(auVar271,auVar219);
          auVar214 = vmaxps_avx(auVar98,auVar239);
          auVar191 = vmaxps_avx(auVar214,auVar191);
          auVar5 = vhaddps_avx(auVar5,auVar191);
          auVar191 = vshufps_avx(auVar87,auVar87,0x54);
          auVar191 = vsubps_avx(auVar191,_local_408);
          auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
          auVar5 = vshufps_avx(auVar5,auVar5,0xe8);
          auVar220._0_4_ = auVar191._0_4_ + auVar16._0_4_;
          auVar220._4_4_ = auVar191._4_4_ + auVar16._4_4_;
          auVar220._8_4_ = auVar191._8_4_ + auVar16._8_4_;
          auVar220._12_4_ = auVar191._12_4_ + auVar16._12_4_;
          auVar201._0_4_ = auVar191._0_4_ + auVar5._0_4_;
          auVar201._4_4_ = auVar191._4_4_ + auVar5._4_4_;
          auVar201._8_4_ = auVar191._8_4_ + auVar5._8_4_;
          auVar201._12_4_ = auVar191._12_4_ + auVar5._12_4_;
          auVar16 = vmaxps_avx(auVar10,auVar220);
          auVar5 = vminps_avx(auVar201,auVar76);
          auVar16 = vcmpps_avx(auVar5,auVar16,1);
          auVar16 = vshufps_avx(auVar16,auVar16,0x50);
          local_4c8 = vinsertps_avx(auVar140,ZEXT416((uint)auVar79._0_4_),0x10);
          if ((auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar16[0xf] < '\0') goto LAB_018b196a;
          bVar71 = 0;
          if (auVar220._0_4_ <= fVar168) {
            auVar257._4_4_ = uStack_344;
            auVar257._0_4_ = local_348;
            auVar257._8_4_ = uStack_340;
            auVar257._12_4_ = uStack_33c;
          }
          else {
            auVar257._4_4_ = uStack_344;
            auVar257._0_4_ = local_348;
            auVar257._8_4_ = uStack_340;
            auVar257._12_4_ = uStack_33c;
            if (auVar201._0_4_ < auVar76._0_4_) {
              auVar5 = vmovshdup_avx(auVar220);
              auVar16 = vcmpps_avx(auVar201,auVar76,1);
              bVar71 = auVar16[4] & auVar140._0_4_ < auVar5._0_4_;
            }
          }
          if (((3 < (uint)uVar67 || fVar151 < 0.001) | bVar71) == 1) {
            lVar69 = 200;
            do {
              fVar75 = auVar191._0_4_;
              fVar90 = 1.0 - fVar75;
              fVar151 = fVar90 * fVar90 * fVar90;
              fVar168 = fVar75 * 3.0 * fVar90 * fVar90;
              fVar90 = fVar90 * fVar75 * fVar75 * 3.0;
              auVar162._4_4_ = fVar151;
              auVar162._0_4_ = fVar151;
              auVar162._8_4_ = fVar151;
              auVar162._12_4_ = fVar151;
              auVar113._4_4_ = fVar168;
              auVar113._0_4_ = fVar168;
              auVar113._8_4_ = fVar168;
              auVar113._12_4_ = fVar168;
              auVar99._4_4_ = fVar90;
              auVar99._0_4_ = fVar90;
              auVar99._8_4_ = fVar90;
              auVar99._12_4_ = fVar90;
              fVar75 = fVar75 * fVar75 * fVar75;
              auVar183._0_4_ = (float)local_278._0_4_ * fVar75;
              auVar183._4_4_ = (float)local_278._4_4_ * fVar75;
              auVar183._8_4_ = fStack_270 * fVar75;
              auVar183._12_4_ = fStack_26c * fVar75;
              auVar16 = vfmadd231ps_fma(auVar183,local_498,auVar99);
              auVar16 = vfmadd231ps_fma(auVar16,local_488,auVar113);
              auVar16 = vfmadd231ps_fma(auVar16,local_478,auVar162);
              auVar100._8_8_ = auVar16._0_8_;
              auVar100._0_8_ = auVar16._0_8_;
              auVar16 = vshufpd_avx(auVar16,auVar16,3);
              auVar5 = vshufps_avx(auVar191,auVar191,0x55);
              auVar16 = vsubps_avx(auVar16,auVar100);
              auVar5 = vfmadd213ps_fma(auVar16,auVar5,auVar100);
              fVar151 = auVar5._0_4_;
              auVar16 = vshufps_avx(auVar5,auVar5,0x55);
              auVar101._0_4_ = fVar170 * fVar151 + fVar172 * auVar16._0_4_;
              auVar101._4_4_ = auVar4._4_4_ * fVar151 + auVar276._4_4_ * auVar16._4_4_;
              auVar101._8_4_ = auVar4._8_4_ * fVar151 + auVar276._8_4_ * auVar16._8_4_;
              auVar101._12_4_ = auVar4._12_4_ * fVar151 + auVar276._12_4_ * auVar16._12_4_;
              auVar191 = vsubps_avx(auVar191,auVar101);
              auVar16 = vandps_avx(auVar257,auVar5);
              auVar5 = vshufps_avx(auVar16,auVar16,0xf5);
              auVar16 = vmaxss_avx(auVar5,auVar16);
              if (auVar16._0_4_ < (float)local_428._0_4_) {
                fVar151 = auVar191._0_4_;
                if ((0.0 <= fVar151) && (fVar151 <= 1.0)) {
                  auVar16 = vmovshdup_avx(auVar191);
                  fVar168 = auVar16._0_4_;
                  if ((0.0 <= fVar168) && (fVar168 <= 1.0)) {
                    auVar16 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar275 = vinsertps_avx(auVar16,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar2 = (ray->super_RayK<1>).org.field_0;
                    auVar16 = vsubps_avx(local_358,(undefined1  [16])aVar2);
                    auVar16 = vdpps_avx(auVar16,auVar275,0x7f);
                    auVar4 = vsubps_avx(local_388,(undefined1  [16])aVar2);
                    auVar4 = vdpps_avx(auVar4,auVar275,0x7f);
                    auVar276 = vsubps_avx(local_398,(undefined1  [16])aVar2);
                    auVar276 = vdpps_avx(auVar276,auVar275,0x7f);
                    auVar5 = vsubps_avx(local_378,(undefined1  [16])aVar2);
                    auVar5 = vdpps_avx(auVar5,auVar275,0x7f);
                    auVar10 = vsubps_avx(_local_368,(undefined1  [16])aVar2);
                    auVar10 = vdpps_avx(auVar10,auVar275,0x7f);
                    auVar76 = vsubps_avx(_local_3a8,(undefined1  [16])aVar2);
                    auVar76 = vdpps_avx(auVar76,auVar275,0x7f);
                    auVar214 = vsubps_avx(_local_3b8,(undefined1  [16])aVar2);
                    auVar214 = vdpps_avx(auVar214,auVar275,0x7f);
                    auVar60._4_4_ = fStack_3e4;
                    auVar60._0_4_ = local_3e8;
                    auVar60._8_4_ = fStack_3e0;
                    auVar60._12_4_ = fStack_3dc;
                    auVar77 = vsubps_avx(auVar60,(undefined1  [16])aVar2);
                    auVar275 = vdpps_avx(auVar77,auVar275,0x7f);
                    fVar170 = 1.0 - fVar168;
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar168)),
                                              ZEXT416((uint)fVar170),auVar16);
                    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar168)),
                                             ZEXT416((uint)fVar170),auVar4);
                    auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar214._0_4_ * fVar168)),
                                               ZEXT416((uint)fVar170),auVar276);
                    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * auVar275._0_4_)),
                                             ZEXT416((uint)fVar170),auVar5);
                    fVar90 = 1.0 - fVar151;
                    fVar168 = fVar90 * fVar151 * fVar151 * 3.0;
                    fVar152 = fVar151 * fVar151 * fVar151;
                    auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar152)),
                                               ZEXT416((uint)fVar168),auVar276);
                    fVar170 = fVar151 * 3.0 * fVar90 * fVar90;
                    auVar4 = vfmadd231ss_fma(auVar276,ZEXT416((uint)fVar170),auVar4);
                    fVar172 = fVar90 * fVar90 * fVar90;
                    auVar16 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar172),auVar16);
                    fVar75 = auVar16._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar75) {
                      fVar188 = (ray->super_RayK<1>).tfar;
                      local_408._0_4_ = fVar188;
                      if ((fVar75 <= fVar188) &&
                         (pGVar12 = (context->scene->geometries).items[uVar64].ptr,
                         (pGVar12->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar16 = vshufps_avx(auVar191,auVar191,0x55);
                        auVar221._8_4_ = 0x3f800000;
                        auVar221._0_8_ = &DAT_3f8000003f800000;
                        auVar221._12_4_ = 0x3f800000;
                        auVar4 = vsubps_avx(auVar221,auVar16);
                        fVar188 = auVar16._0_4_;
                        auVar228._0_4_ = fVar188 * (float)local_368._0_4_;
                        fVar150 = auVar16._4_4_;
                        auVar228._4_4_ = fVar150 * (float)local_368._4_4_;
                        fVar167 = auVar16._8_4_;
                        auVar228._8_4_ = fVar167 * fStack_360;
                        fVar169 = auVar16._12_4_;
                        auVar228._12_4_ = fVar169 * fStack_35c;
                        auVar240._0_4_ = fVar188 * (float)local_3a8._0_4_;
                        auVar240._4_4_ = fVar150 * (float)local_3a8._4_4_;
                        auVar240._8_4_ = fVar167 * fStack_3a0;
                        auVar240._12_4_ = fVar169 * fStack_39c;
                        auVar248._0_4_ = fVar188 * (float)local_3b8._0_4_;
                        auVar248._4_4_ = fVar150 * (float)local_3b8._4_4_;
                        auVar248._8_4_ = fVar167 * fStack_3b0;
                        auVar248._12_4_ = fVar169 * fStack_3ac;
                        auVar202._0_4_ = fVar188 * local_3e8;
                        auVar202._4_4_ = fVar150 * fStack_3e4;
                        auVar202._8_4_ = fVar167 * fStack_3e0;
                        auVar202._12_4_ = fVar169 * fStack_3dc;
                        auVar16 = vfmadd231ps_fma(auVar228,auVar4,local_358);
                        auVar276 = vfmadd231ps_fma(auVar240,auVar4,local_388);
                        auVar5 = vfmadd231ps_fma(auVar248,auVar4,local_398);
                        auVar10 = vfmadd231ps_fma(auVar202,auVar4,local_378);
                        auVar16 = vsubps_avx(auVar276,auVar16);
                        auVar4 = vsubps_avx(auVar5,auVar276);
                        auVar276 = vsubps_avx(auVar10,auVar5);
                        auVar249._0_4_ = fVar151 * auVar4._0_4_;
                        auVar249._4_4_ = fVar151 * auVar4._4_4_;
                        auVar249._8_4_ = fVar151 * auVar4._8_4_;
                        auVar249._12_4_ = fVar151 * auVar4._12_4_;
                        auVar184._4_4_ = fVar90;
                        auVar184._0_4_ = fVar90;
                        auVar184._8_4_ = fVar90;
                        auVar184._12_4_ = fVar90;
                        auVar16 = vfmadd231ps_fma(auVar249,auVar184,auVar16);
                        auVar203._0_4_ = fVar151 * auVar276._0_4_;
                        auVar203._4_4_ = fVar151 * auVar276._4_4_;
                        auVar203._8_4_ = fVar151 * auVar276._8_4_;
                        auVar203._12_4_ = fVar151 * auVar276._12_4_;
                        auVar4 = vfmadd231ps_fma(auVar203,auVar184,auVar4);
                        auVar204._0_4_ = fVar151 * auVar4._0_4_;
                        auVar204._4_4_ = fVar151 * auVar4._4_4_;
                        auVar204._8_4_ = fVar151 * auVar4._8_4_;
                        auVar204._12_4_ = fVar151 * auVar4._12_4_;
                        auVar4 = vfmadd231ps_fma(auVar204,auVar184,auVar16);
                        auVar163._0_4_ = fVar152 * (float)local_2c8._0_4_;
                        auVar163._4_4_ = fVar152 * (float)local_2c8._4_4_;
                        auVar163._8_4_ = fVar152 * fStack_2c0;
                        auVar163._12_4_ = fVar152 * fStack_2bc;
                        auVar114._4_4_ = fVar168;
                        auVar114._0_4_ = fVar168;
                        auVar114._8_4_ = fVar168;
                        auVar114._12_4_ = fVar168;
                        auVar16 = vfmadd132ps_fma(auVar114,auVar163,local_2b8);
                        auVar146._4_4_ = fVar170;
                        auVar146._0_4_ = fVar170;
                        auVar146._8_4_ = fVar170;
                        auVar146._12_4_ = fVar170;
                        auVar16 = vfmadd132ps_fma(auVar146,auVar16,local_2a8);
                        auVar164._0_4_ = auVar4._0_4_ * 3.0;
                        auVar164._4_4_ = auVar4._4_4_ * 3.0;
                        auVar164._8_4_ = auVar4._8_4_ * 3.0;
                        auVar164._12_4_ = auVar4._12_4_ * 3.0;
                        auVar129._4_4_ = fVar172;
                        auVar129._0_4_ = fVar172;
                        auVar129._8_4_ = fVar172;
                        auVar129._12_4_ = fVar172;
                        auVar4 = vfmadd132ps_fma(auVar129,auVar16,local_298);
                        auVar16 = vshufps_avx(auVar164,auVar164,0xc9);
                        auVar115._0_4_ = auVar4._0_4_ * auVar16._0_4_;
                        auVar115._4_4_ = auVar4._4_4_ * auVar16._4_4_;
                        auVar115._8_4_ = auVar4._8_4_ * auVar16._8_4_;
                        auVar115._12_4_ = auVar4._12_4_ * auVar16._12_4_;
                        auVar16 = vshufps_avx(auVar4,auVar4,0xc9);
                        auVar16 = vfmsub231ps_fma(auVar115,auVar164,auVar16);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar75;
                          auVar4 = vshufps_avx(auVar16,auVar16,0xe9);
                          uVar173 = vmovlps_avx(auVar4);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar173;
                          (ray->Ng).field_0.field_0.z = auVar16._0_4_;
                          uVar173 = vmovlps_avx(auVar191);
                          ray->u = (float)(int)uVar173;
                          ray->v = (float)(int)((ulong)uVar173 >> 0x20);
                          ray->primID = (uint)local_410;
                          ray->geomID = uVar64;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar4 = vshufps_avx(auVar16,auVar16,0xe9);
                          local_2f8 = vmovlps_avx(auVar4);
                          local_2f0 = auVar16._0_4_;
                          local_2ec = vmovlps_avx(auVar191);
                          local_2e4 = (uint)local_410;
                          local_2e0 = uVar64;
                          local_2dc = context->user->instID[0];
                          local_2d8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar75;
                          local_49c = -1;
                          local_338.valid = &local_49c;
                          local_338.geometryUserPtr = pGVar12->userPtr;
                          local_338.context = context->user;
                          local_338.ray = (RTCRayN *)ray;
                          local_338.hit = (RTCHitN *)&local_2f8;
                          local_338.N = 1;
                          if ((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar12->intersectionFilterN)(&local_338), *local_338.valid != 0)) {
                            p_Var13 = context->args->filter;
                            if (p_Var13 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var13)(&local_338);
                              }
                              if (*local_338.valid == 0) goto LAB_018b1b96;
                            }
                            (((Vec3f *)((long)local_338.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_338.hit;
                            (((Vec3f *)((long)local_338.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_338.hit + 4);
                            (((Vec3f *)((long)local_338.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_338.hit + 8);
                            *(float *)((long)local_338.ray + 0x3c) = *(float *)(local_338.hit + 0xc)
                            ;
                            *(float *)((long)local_338.ray + 0x40) =
                                 *(float *)(local_338.hit + 0x10);
                            *(float *)((long)local_338.ray + 0x44) =
                                 *(float *)(local_338.hit + 0x14);
                            *(float *)((long)local_338.ray + 0x48) =
                                 *(float *)(local_338.hit + 0x18);
                            *(float *)((long)local_338.ray + 0x4c) =
                                 *(float *)(local_338.hit + 0x1c);
                            *(float *)((long)local_338.ray + 0x50) =
                                 *(float *)(local_338.hit + 0x20);
                          }
                          else {
LAB_018b1b96:
                            (ray->super_RayK<1>).tfar = (float)local_408._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar69 = lVar69 + -1;
            } while (lVar69 != 0);
          }
          else {
            bVar57 = false;
          }
        }
      }
      auVar282 = ZEXT464(0x3f800000);
      auVar16 = local_448._0_16_;
    } while (bVar57);
    local_448._0_16_ = auVar16;
    local_288 = vinsertps_avx(local_448._0_16_,ZEXT416((uint)local_468),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }